

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  byte bVar59;
  ulong uVar60;
  long lVar61;
  long lVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  uint uVar66;
  Geometry *geometry;
  long lVar67;
  ulong uVar68;
  byte bVar69;
  float fVar70;
  float fVar71;
  float fVar120;
  float fVar122;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar126;
  float fVar127;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  float fVar128;
  undefined4 uVar129;
  float fVar139;
  vint4 bi_2;
  undefined1 auVar130 [16];
  float fVar140;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [64];
  undefined8 uVar141;
  vint4 bi_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  vint4 ai_2;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vint4 ai_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar170;
  float fVar171;
  float fVar174;
  vint4 ai;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  vint<16> mask;
  float old_t_1;
  RTCFilterFunctionNArguments local_910;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  LinearSpace3fa *local_7d0;
  Primitive *local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_710 [8];
  float fStack_708;
  float fStack_704;
  uint local_700;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  uint uStack_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [64];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined4 local_5e0;
  int local_5dc;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  float local_580 [4];
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 auStack_420 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar6 = prim[1];
  uVar60 = (ulong)(byte)PVar6;
  lVar25 = uVar60 * 0x25;
  fVar128 = *(float *)(prim + lVar25 + 0x12);
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar76 = vsubps_avx(auVar76,*(undefined1 (*) [16])(prim + lVar25 + 6));
  auVar153._0_4_ = fVar128 * auVar76._0_4_;
  auVar153._4_4_ = fVar128 * auVar76._4_4_;
  auVar153._8_4_ = fVar128 * auVar76._8_4_;
  auVar153._12_4_ = fVar128 * auVar76._12_4_;
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar130._0_4_ = fVar128 * auVar75._0_4_;
  auVar130._4_4_ = fVar128 * auVar75._4_4_;
  auVar130._8_4_ = fVar128 * auVar75._8_4_;
  auVar130._12_4_ = fVar128 * auVar75._12_4_;
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xf + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar60 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1a + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1b + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1c + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar165._4_4_ = auVar130._0_4_;
  auVar165._0_4_ = auVar130._0_4_;
  auVar165._8_4_ = auVar130._0_4_;
  auVar165._12_4_ = auVar130._0_4_;
  auVar78 = vshufps_avx(auVar130,auVar130,0x55);
  auVar79 = vshufps_avx(auVar130,auVar130,0xaa);
  fVar128 = auVar79._0_4_;
  auVar147._0_4_ = fVar128 * auVar77._0_4_;
  fVar152 = auVar79._4_4_;
  auVar147._4_4_ = fVar152 * auVar77._4_4_;
  fVar139 = auVar79._8_4_;
  auVar147._8_4_ = fVar139 * auVar77._8_4_;
  fVar140 = auVar79._12_4_;
  auVar147._12_4_ = fVar140 * auVar77._12_4_;
  auVar142._0_4_ = auVar20._0_4_ * fVar128;
  auVar142._4_4_ = auVar20._4_4_ * fVar152;
  auVar142._8_4_ = auVar20._8_4_ * fVar139;
  auVar142._12_4_ = auVar20._12_4_ * fVar140;
  auVar131._0_4_ = auVar23._0_4_ * fVar128;
  auVar131._4_4_ = auVar23._4_4_ * fVar152;
  auVar131._8_4_ = auVar23._8_4_ * fVar139;
  auVar131._12_4_ = auVar23._12_4_ * fVar140;
  auVar79 = vfmadd231ps_fma(auVar147,auVar78,auVar75);
  auVar27 = vfmadd231ps_fma(auVar142,auVar78,auVar19);
  auVar78 = vfmadd231ps_fma(auVar131,auVar22,auVar78);
  auVar80 = vfmadd231ps_fma(auVar79,auVar165,auVar76);
  auVar27 = vfmadd231ps_fma(auVar27,auVar165,auVar18);
  auVar28 = vfmadd231ps_fma(auVar78,auVar21,auVar165);
  auVar186._4_4_ = auVar153._0_4_;
  auVar186._0_4_ = auVar153._0_4_;
  auVar186._8_4_ = auVar153._0_4_;
  auVar186._12_4_ = auVar153._0_4_;
  auVar78 = vshufps_avx(auVar153,auVar153,0x55);
  auVar79 = vshufps_avx(auVar153,auVar153,0xaa);
  fVar128 = auVar79._0_4_;
  auVar166._0_4_ = fVar128 * auVar77._0_4_;
  fVar152 = auVar79._4_4_;
  auVar166._4_4_ = fVar152 * auVar77._4_4_;
  fVar139 = auVar79._8_4_;
  auVar166._8_4_ = fVar139 * auVar77._8_4_;
  fVar140 = auVar79._12_4_;
  auVar166._12_4_ = fVar140 * auVar77._12_4_;
  auVar159._0_4_ = auVar20._0_4_ * fVar128;
  auVar159._4_4_ = auVar20._4_4_ * fVar152;
  auVar159._8_4_ = auVar20._8_4_ * fVar139;
  auVar159._12_4_ = auVar20._12_4_ * fVar140;
  auVar154._0_4_ = auVar23._0_4_ * fVar128;
  auVar154._4_4_ = auVar23._4_4_ * fVar152;
  auVar154._8_4_ = auVar23._8_4_ * fVar139;
  auVar154._12_4_ = auVar23._12_4_ * fVar140;
  auVar75 = vfmadd231ps_fma(auVar166,auVar78,auVar75);
  auVar77 = vfmadd231ps_fma(auVar159,auVar78,auVar19);
  auVar19 = vfmadd231ps_fma(auVar154,auVar78,auVar22);
  auVar29 = vfmadd231ps_fma(auVar75,auVar186,auVar76);
  auVar130 = vfmadd231ps_fma(auVar77,auVar186,auVar18);
  auVar178._8_4_ = 0x7fffffff;
  auVar178._0_8_ = 0x7fffffff7fffffff;
  auVar178._12_4_ = 0x7fffffff;
  auVar131 = vfmadd231ps_fma(auVar19,auVar186,auVar21);
  auVar76 = vandps_avx(auVar178,auVar80);
  auVar175._8_4_ = 0x219392ef;
  auVar175._0_8_ = 0x219392ef219392ef;
  auVar175._12_4_ = 0x219392ef;
  uVar68 = vcmpps_avx512vl(auVar76,auVar175,1);
  bVar12 = (bool)((byte)uVar68 & 1);
  auVar72._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar80._0_4_;
  bVar12 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar80._4_4_;
  bVar12 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar80._8_4_;
  bVar12 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar80._12_4_;
  auVar76 = vandps_avx(auVar178,auVar27);
  uVar68 = vcmpps_avx512vl(auVar76,auVar175,1);
  bVar12 = (bool)((byte)uVar68 & 1);
  auVar73._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._0_4_;
  bVar12 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._4_4_;
  bVar12 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._8_4_;
  bVar12 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._12_4_;
  auVar76 = vandps_avx(auVar178,auVar28);
  uVar68 = vcmpps_avx512vl(auVar76,auVar175,1);
  bVar12 = (bool)((byte)uVar68 & 1);
  auVar74._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._0_4_;
  bVar12 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._4_4_;
  bVar12 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._8_4_;
  bVar12 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._12_4_;
  auVar75 = vrcp14ps_avx512vl(auVar72);
  auVar176._8_4_ = 0x3f800000;
  auVar176._0_8_ = 0x3f8000003f800000;
  auVar176._12_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar72,auVar75,auVar176);
  auVar80 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar73);
  auVar76 = vfnmadd213ps_fma(auVar73,auVar75,auVar176);
  auVar28 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar74);
  auVar76 = vfnmadd213ps_fma(auVar74,auVar75,auVar176);
  auVar26 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  fVar128 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar172._4_4_ = fVar128;
  auVar172._0_4_ = fVar128;
  auVar172._8_4_ = fVar128;
  auVar172._12_4_ = fVar128;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar76 = vpmovsxwd_avx(auVar76);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar18 = vsubps_avx(auVar75,auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar75 = vpmovsxwd_avx(auVar77);
  auVar77 = vfmadd213ps_fma(auVar18,auVar172,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar75);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar75 = vpmovsxwd_avx(auVar18);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar18 = vfmadd213ps_fma(auVar75,auVar172,auVar76);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar76 = vpmovsxwd_avx(auVar19);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar68 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar60 * 2 + uVar68 + 6);
  auVar75 = vpmovsxwd_avx(auVar20);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar19 = vfmadd213ps_fma(auVar75,auVar172,auVar76);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar76 = vpmovsxwd_avx(auVar21);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar60 * 0x18 + 6);
  auVar75 = vpmovsxwd_avx(auVar22);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar20 = vfmadd213ps_fma(auVar75,auVar172,auVar76);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar60 * 0x1d + 6);
  auVar76 = vpmovsxwd_avx(auVar23);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar60 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar75 = vpmovsxwd_avx(auVar78);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar21 = vfmadd213ps_fma(auVar75,auVar172,auVar76);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar60) + 6);
  auVar76 = vpmovsxwd_avx(auVar79);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar60 * 0x23 + 6);
  auVar75 = vpmovsxwd_avx(auVar27);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar75 = vfmadd213ps_fma(auVar75,auVar172,auVar76);
  auVar76 = vsubps_avx(auVar77,auVar29);
  auVar173._0_4_ = auVar80._0_4_ * auVar76._0_4_;
  auVar173._4_4_ = auVar80._4_4_ * auVar76._4_4_;
  auVar173._8_4_ = auVar80._8_4_ * auVar76._8_4_;
  auVar173._12_4_ = auVar80._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar18,auVar29);
  auVar148._0_4_ = auVar80._0_4_ * auVar76._0_4_;
  auVar148._4_4_ = auVar80._4_4_ * auVar76._4_4_;
  auVar148._8_4_ = auVar80._8_4_ * auVar76._8_4_;
  auVar148._12_4_ = auVar80._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar19,auVar130);
  auVar167._0_4_ = auVar28._0_4_ * auVar76._0_4_;
  auVar167._4_4_ = auVar28._4_4_ * auVar76._4_4_;
  auVar167._8_4_ = auVar28._8_4_ * auVar76._8_4_;
  auVar167._12_4_ = auVar28._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar20,auVar130);
  auVar143._0_4_ = auVar28._0_4_ * auVar76._0_4_;
  auVar143._4_4_ = auVar28._4_4_ * auVar76._4_4_;
  auVar143._8_4_ = auVar28._8_4_ * auVar76._8_4_;
  auVar143._12_4_ = auVar28._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar21,auVar131);
  auVar160._0_4_ = auVar26._0_4_ * auVar76._0_4_;
  auVar160._4_4_ = auVar26._4_4_ * auVar76._4_4_;
  auVar160._8_4_ = auVar26._8_4_ * auVar76._8_4_;
  auVar160._12_4_ = auVar26._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar75,auVar131);
  auVar132._0_4_ = auVar26._0_4_ * auVar76._0_4_;
  auVar132._4_4_ = auVar26._4_4_ * auVar76._4_4_;
  auVar132._8_4_ = auVar26._8_4_ * auVar76._8_4_;
  auVar132._12_4_ = auVar26._12_4_ * auVar76._12_4_;
  auVar76 = vpminsd_avx(auVar173,auVar148);
  auVar75 = vpminsd_avx(auVar167,auVar143);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar75 = vpminsd_avx(auVar160,auVar132);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar80._4_4_ = uVar129;
  auVar80._0_4_ = uVar129;
  auVar80._8_4_ = uVar129;
  auVar80._12_4_ = uVar129;
  auVar75 = vmaxps_avx512vl(auVar75,auVar80);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar28._8_4_ = 0x3f7ffffa;
  auVar28._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar28._12_4_ = 0x3f7ffffa;
  local_650 = vmulps_avx512vl(auVar76,auVar28);
  auVar76 = vpmaxsd_avx(auVar173,auVar148);
  auVar75 = vpmaxsd_avx(auVar167,auVar143);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar75 = vpmaxsd_avx(auVar160,auVar132);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar26._4_4_ = uVar129;
  auVar26._0_4_ = uVar129;
  auVar26._8_4_ = uVar129;
  auVar26._12_4_ = uVar129;
  auVar75 = vminps_avx512vl(auVar75,auVar26);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar29);
  auVar75 = vpbroadcastd_avx512vl();
  uVar141 = vcmpps_avx512vl(local_650,auVar76,2);
  uVar68 = vpcmpgtd_avx512vl(auVar75,_DAT_01f7fcf0);
  uVar68 = ((byte)uVar141 & 0xf) & uVar68;
  if ((char)uVar68 == '\0') {
    bVar69 = 0;
  }
  else {
    local_7d0 = pre->ray_space + k;
    auVar138 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar138);
    local_7c8 = prim;
    do {
      lVar25 = 0;
      for (uVar60 = uVar68; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar7 = *(uint *)(local_7c8 + 2);
      pGVar9 = (context->scene->geometries).items[uVar7].ptr;
      local_4c0._0_8_ = CONCAT44(0,*(uint *)(local_7c8 + lVar25 * 4 + 6));
      uVar60 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               CONCAT44(0,*(uint *)(local_7c8 + lVar25 * 4 + 6)) *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar128 = (pGVar9->time_range).lower;
      fVar128 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar128) /
                ((pGVar9->time_range).upper - fVar128));
      auVar76 = vroundss_avx(ZEXT416((uint)fVar128),ZEXT416((uint)fVar128),9);
      auVar76 = vminss_avx(auVar76,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar76);
      fVar128 = fVar128 - auVar76._0_4_;
      _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar62 = (long)(int)auVar76._0_4_ * 0x38;
      lVar25 = *(long *)(_Var10 + 0x10 + lVar62);
      lVar67 = *(long *)(_Var10 + 0x38 + lVar62);
      lVar61 = *(long *)(_Var10 + 0x48 + lVar62);
      auVar144._4_4_ = fVar128;
      auVar144._0_4_ = fVar128;
      auVar144._8_4_ = fVar128;
      auVar144._12_4_ = fVar128;
      pfVar3 = (float *)(lVar67 + uVar60 * lVar61);
      auVar179._0_4_ = fVar128 * *pfVar3;
      auVar179._4_4_ = fVar128 * pfVar3[1];
      auVar179._8_4_ = fVar128 * pfVar3[2];
      auVar179._12_4_ = fVar128 * pfVar3[3];
      pfVar3 = (float *)(lVar67 + (uVar60 + 1) * lVar61);
      auVar180._0_4_ = fVar128 * *pfVar3;
      auVar180._4_4_ = fVar128 * pfVar3[1];
      auVar180._8_4_ = fVar128 * pfVar3[2];
      auVar180._12_4_ = fVar128 * pfVar3[3];
      uVar63 = (uVar60 + 2) * lVar61;
      auVar76 = vmulps_avx512vl(auVar144,*(undefined1 (*) [16])(lVar67 + uVar63));
      auVar75 = vmulps_avx512vl(auVar144,*(undefined1 (*) [16])(lVar67 + lVar61 * (uVar60 + 3)));
      lVar67 = *(long *)(_Var10 + lVar62);
      fVar128 = 1.0 - fVar128;
      auVar133._4_4_ = fVar128;
      auVar133._0_4_ = fVar128;
      auVar133._8_4_ = fVar128;
      auVar133._12_4_ = fVar128;
      local_870 = vfmadd231ps_fma(auVar179,auVar133,*(undefined1 (*) [16])(lVar67 + lVar25 * uVar60)
                                 );
      local_880 = vfmadd231ps_fma(auVar180,auVar133,
                                  *(undefined1 (*) [16])(lVar67 + lVar25 * (uVar60 + 1)));
      local_890 = vfmadd231ps_avx512vl
                            (auVar76,auVar133,*(undefined1 (*) [16])(lVar67 + lVar25 * (uVar60 + 2))
                            );
      _local_710 = vfmadd231ps_avx512vl
                             (auVar75,auVar133,
                              *(undefined1 (*) [16])(lVar67 + lVar25 * (uVar60 + 3)));
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      lVar25 = (long)iVar8 * 0x44;
      auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar77 = vsubps_avx(local_870,auVar76);
      uVar129 = auVar77._0_4_;
      auVar149._4_4_ = uVar129;
      auVar149._0_4_ = uVar129;
      auVar149._8_4_ = uVar129;
      auVar149._12_4_ = uVar129;
      auVar75 = vshufps_avx(auVar77,auVar77,0x55);
      aVar4 = (local_7d0->vx).field_0;
      aVar5 = (local_7d0->vy).field_0;
      fVar128 = (local_7d0->vz).field_0.m128[0];
      fVar152 = *(float *)((long)&(local_7d0->vz).field_0 + 4);
      fVar139 = *(float *)((long)&(local_7d0->vz).field_0 + 8);
      fVar140 = *(float *)((long)&(local_7d0->vz).field_0 + 0xc);
      auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
      auVar182._0_4_ = fVar128 * auVar77._0_4_;
      auVar182._4_4_ = fVar152 * auVar77._4_4_;
      auVar182._8_4_ = fVar139 * auVar77._8_4_;
      auVar182._12_4_ = fVar140 * auVar77._12_4_;
      auVar75 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar5,auVar75);
      auVar18 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar149);
      auVar77 = vsubps_avx(local_880,auVar76);
      uVar129 = auVar77._0_4_;
      auVar150._4_4_ = uVar129;
      auVar150._0_4_ = uVar129;
      auVar150._8_4_ = uVar129;
      auVar150._12_4_ = uVar129;
      auVar75 = vshufps_avx(auVar77,auVar77,0x55);
      auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
      auVar183._0_4_ = fVar128 * auVar77._0_4_;
      auVar183._4_4_ = fVar152 * auVar77._4_4_;
      auVar183._8_4_ = fVar139 * auVar77._8_4_;
      auVar183._12_4_ = fVar140 * auVar77._12_4_;
      auVar75 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar5,auVar75);
      auVar19 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar150);
      auVar77 = vsubps_avx512vl(local_890,auVar76);
      uVar129 = auVar77._0_4_;
      auVar151._4_4_ = uVar129;
      auVar151._0_4_ = uVar129;
      auVar151._8_4_ = uVar129;
      auVar151._12_4_ = uVar129;
      auVar75 = vshufps_avx(auVar77,auVar77,0x55);
      auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
      auVar184._0_4_ = fVar128 * auVar77._0_4_;
      auVar184._4_4_ = fVar152 * auVar77._4_4_;
      auVar184._8_4_ = fVar139 * auVar77._8_4_;
      auVar184._12_4_ = fVar140 * auVar77._12_4_;
      auVar75 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar5,auVar75);
      auVar77 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar151);
      auVar75 = vsubps_avx512vl(_local_710,auVar76);
      uVar129 = auVar75._0_4_;
      auVar145._4_4_ = uVar129;
      auVar145._0_4_ = uVar129;
      auVar145._8_4_ = uVar129;
      auVar145._12_4_ = uVar129;
      auVar76 = vshufps_avx(auVar75,auVar75,0x55);
      auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
      auVar188._0_4_ = fVar128 * auVar75._0_4_;
      auVar188._4_4_ = fVar152 * auVar75._4_4_;
      auVar188._8_4_ = fVar139 * auVar75._8_4_;
      auVar188._12_4_ = fVar140 * auVar75._12_4_;
      auVar76 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar5,auVar76);
      auVar20 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar4,auVar145);
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      uVar129 = auVar18._0_4_;
      local_760._4_4_ = uVar129;
      local_760._0_4_ = uVar129;
      local_760._8_4_ = uVar129;
      local_760._12_4_ = uVar129;
      local_760._16_4_ = uVar129;
      local_760._20_4_ = uVar129;
      local_760._24_4_ = uVar129;
      local_760._28_4_ = uVar129;
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      auVar81._8_4_ = 1;
      auVar81._0_8_ = 0x100000001;
      auVar81._12_4_ = 1;
      auVar81._16_4_ = 1;
      auVar81._20_4_ = 1;
      auVar81._24_4_ = 1;
      auVar81._28_4_ = 1;
      local_780 = vpermps_avx2(auVar81,ZEXT1632(auVar18));
      uVar129 = auVar19._0_4_;
      local_8c0._4_4_ = uVar129;
      local_8c0._0_4_ = uVar129;
      local_8c0._8_4_ = uVar129;
      local_8c0._12_4_ = uVar129;
      local_8c0._16_4_ = uVar129;
      local_8c0._20_4_ = uVar129;
      local_8c0._24_4_ = uVar129;
      local_8c0._28_4_ = uVar129;
      local_8e0 = vpermps_avx512vl(auVar81,ZEXT1632(auVar19));
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      local_800 = vbroadcastss_avx512vl(auVar77);
      auVar201 = ZEXT3264(local_800);
      local_820 = vpermps_avx512vl(auVar81,ZEXT1632(auVar77));
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0xd8c);
      local_840 = vbroadcastss_avx512vl(auVar20);
      auVar138 = ZEXT3264(local_840);
      local_860 = vpermps_avx512vl(auVar81,ZEXT1632(auVar20));
      auVar200 = ZEXT3264(local_860);
      auVar81 = vmulps_avx512vl(local_840,auVar93);
      auVar82 = vmulps_avx512vl(local_860,auVar93);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar94,local_800);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar94,local_820);
      auVar76 = vfmadd231ps_fma(auVar81,auVar98,local_8c0);
      auVar83 = vfmadd231ps_avx512vl(auVar82,auVar98,local_8e0);
      auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar96,local_760);
      auVar81 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar82 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      auVar85 = vfmadd231ps_avx512vl(auVar83,auVar96,local_780);
      auVar83 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0xd8c);
      auVar86 = vmulps_avx512vl(local_840,auVar83);
      auVar87 = vmulps_avx512vl(local_860,auVar83);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar92,local_800);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar92,local_820);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar82,local_8c0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar82,local_8e0);
      auVar21 = vfmadd231ps_fma(auVar86,auVar81,local_760);
      auVar22 = vfmadd231ps_fma(auVar87,auVar81,local_780);
      auVar87 = vsubps_avx512vl(ZEXT1632(auVar21),auVar84);
      auVar88 = vsubps_avx512vl(ZEXT1632(auVar22),auVar85);
      auVar86 = vmulps_avx512vl(auVar85,auVar87);
      auVar89 = vmulps_avx512vl(auVar84,auVar88);
      auVar86 = vsubps_avx512vl(auVar86,auVar89);
      auVar76 = vshufps_avx(local_870,local_870,0xff);
      uVar141 = auVar76._0_8_;
      local_320._8_8_ = uVar141;
      local_320._0_8_ = uVar141;
      local_320._16_8_ = uVar141;
      local_320._24_8_ = uVar141;
      auVar76 = vshufps_avx(local_880,local_880,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar76);
      auVar76 = vshufps_avx512vl(local_890,local_890,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar76);
      auVar76 = vshufps_avx512vl(_local_710,_local_710,0xff);
      uVar141 = auVar76._0_8_;
      register0x000012c8 = uVar141;
      local_380 = uVar141;
      register0x000012d0 = uVar141;
      register0x000012d8 = uVar141;
      auVar89 = vmulps_avx512vl(_local_380,auVar93);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,local_360);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar98,local_340);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar96,local_320);
      auVar90 = vmulps_avx512vl(_local_380,auVar83);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,local_360);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar82,local_340);
      auVar23 = vfmadd231ps_fma(auVar90,auVar81,local_320);
      auVar90 = vmulps_avx512vl(auVar88,auVar88);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar87);
      auVar91 = vmaxps_avx512vl(auVar89,ZEXT1632(auVar23));
      auVar91 = vmulps_avx512vl(auVar91,auVar91);
      auVar90 = vmulps_avx512vl(auVar91,auVar90);
      auVar86 = vmulps_avx512vl(auVar86,auVar86);
      uVar141 = vcmpps_avx512vl(auVar86,auVar90,2);
      auVar76 = vblendps_avx(auVar18,local_870,8);
      auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar75 = vandps_avx512vl(auVar76,auVar78);
      auVar76 = vblendps_avx(auVar19,local_880,8);
      auVar76 = vandps_avx512vl(auVar76,auVar78);
      auVar75 = vmaxps_avx(auVar75,auVar76);
      auVar76 = vblendps_avx(auVar77,local_890,8);
      auVar79 = vandps_avx512vl(auVar76,auVar78);
      auVar76 = vblendps_avx(auVar20,_local_710,8);
      auVar76 = vandps_avx512vl(auVar76,auVar78);
      auVar76 = vmaxps_avx(auVar79,auVar76);
      auVar76 = vmaxps_avx(auVar75,auVar76);
      auVar75 = vmovshdup_avx(auVar76);
      auVar75 = vmaxss_avx(auVar75,auVar76);
      auVar76 = vshufpd_avx(auVar76,auVar76,1);
      auVar76 = vmaxss_avx(auVar76,auVar75);
      auVar75 = vcvtsi2ss_avx512f(_local_710,iVar8);
      local_500._0_16_ = auVar75;
      auVar90._0_4_ = auVar75._0_4_;
      auVar90._4_4_ = auVar90._0_4_;
      auVar90._8_4_ = auVar90._0_4_;
      auVar90._12_4_ = auVar90._0_4_;
      auVar90._16_4_ = auVar90._0_4_;
      auVar90._20_4_ = auVar90._0_4_;
      auVar90._24_4_ = auVar90._0_4_;
      auVar90._28_4_ = auVar90._0_4_;
      uVar24 = vcmpps_avx512vl(auVar90,_DAT_01faff40,0xe);
      bVar69 = (byte)uVar141 & (byte)uVar24;
      fVar128 = auVar76._0_4_ * 4.7683716e-07;
      auVar86._8_4_ = 2;
      auVar86._0_8_ = 0x200000002;
      auVar86._12_4_ = 2;
      auVar86._16_4_ = 2;
      auVar86._20_4_ = 2;
      auVar86._24_4_ = 2;
      auVar86._28_4_ = 2;
      local_3a0 = vpermps_avx512vl(auVar86,ZEXT1632(auVar18));
      local_3c0 = vpermps_avx512vl(auVar86,ZEXT1632(auVar19));
      local_3e0 = vpermps_avx512vl(auVar86,ZEXT1632(auVar77));
      auVar86 = vpermps_avx2(auVar86,ZEXT1632(auVar20));
      uVar66 = *(uint *)(ray + k * 4 + 0xc0);
      auVar76 = local_3a0._0_16_;
      if (bVar69 == 0) {
        uVar63 = 0;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar195 = ZEXT3264(auVar96);
        auVar76 = vxorps_avx512vl(auVar76,auVar76);
        auVar196 = ZEXT1664(auVar76);
        auVar197 = ZEXT3264(local_760);
        auVar198 = ZEXT3264(local_780);
        auVar194 = ZEXT3264(local_8c0);
        auVar193 = ZEXT3264(local_8e0);
        auVar199 = ZEXT3264(local_820);
      }
      else {
        local_7c0._0_16_ = ZEXT416(uVar66);
        auVar83 = vmulps_avx512vl(auVar86,auVar83);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_3e0,auVar83);
        auVar82 = vfmadd213ps_avx512vl(auVar82,local_3c0,auVar92);
        auVar91 = vfmadd213ps_avx512vl(auVar81,local_3a0,auVar82);
        auVar93 = vmulps_avx512vl(auVar86,auVar93);
        auVar94 = vfmadd213ps_avx512vl(auVar94,local_3e0,auVar93);
        auVar82 = vfmadd213ps_avx512vl(auVar98,local_3c0,auVar94);
        auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        auVar81 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1f9c);
        auVar95 = vfmadd213ps_avx512vl(auVar96,local_3a0,auVar82);
        auVar96 = vmulps_avx512vl(local_840,auVar81);
        auVar82 = vmulps_avx512vl(local_860,auVar81);
        auVar185._0_4_ = auVar86._0_4_ * auVar81._0_4_;
        auVar185._4_4_ = auVar86._4_4_ * auVar81._4_4_;
        auVar185._8_4_ = auVar86._8_4_ * auVar81._8_4_;
        auVar185._12_4_ = auVar86._12_4_ * auVar81._12_4_;
        auVar185._16_4_ = auVar86._16_4_ * auVar81._16_4_;
        auVar185._20_4_ = auVar86._20_4_ * auVar81._20_4_;
        auVar185._24_4_ = auVar86._24_4_ * auVar81._24_4_;
        auVar185._28_4_ = 0;
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_800);
        auVar81 = vfmadd231ps_avx512vl(auVar82,auVar93,local_820);
        auVar93 = vfmadd231ps_avx512vl(auVar185,local_3e0,auVar93);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,local_8c0);
        auVar81 = vfmadd231ps_avx512vl(auVar81,auVar94,local_8e0);
        auVar82 = vfmadd231ps_avx512vl(auVar93,local_3c0,auVar94);
        auVar92 = vfmadd231ps_avx512vl(auVar96,auVar98,local_760);
        auVar81 = vfmadd231ps_avx512vl(auVar81,auVar98,local_780);
        auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1f9c);
        auVar82 = vfmadd231ps_avx512vl(auVar82,local_3a0,auVar98);
        auVar83 = vmulps_avx512vl(local_840,auVar93);
        auVar97 = vmulps_avx512vl(local_860,auVar93);
        auVar98._4_4_ = auVar86._4_4_ * auVar93._4_4_;
        auVar98._0_4_ = auVar86._0_4_ * auVar93._0_4_;
        auVar98._8_4_ = auVar86._8_4_ * auVar93._8_4_;
        auVar98._12_4_ = auVar86._12_4_ * auVar93._12_4_;
        auVar98._16_4_ = auVar86._16_4_ * auVar93._16_4_;
        auVar98._20_4_ = auVar86._20_4_ * auVar93._20_4_;
        auVar98._24_4_ = auVar86._24_4_ * auVar93._24_4_;
        auVar98._28_4_ = auVar93._28_4_;
        auVar93 = vfmadd231ps_avx512vl(auVar83,auVar94,local_800);
        auVar83 = vfmadd231ps_avx512vl(auVar97,auVar94,local_820);
        auVar94 = vfmadd231ps_avx512vl(auVar98,local_3e0,auVar94);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_8c0);
        auVar83 = vfmadd231ps_avx512vl(auVar83,auVar98,local_8e0);
        auVar98 = vfmadd231ps_avx512vl(auVar94,local_3c0,auVar98);
        auVar94 = vfmadd231ps_avx512vl(auVar93,auVar96,local_760);
        auVar93 = vfmadd231ps_avx512vl(auVar83,auVar96,local_780);
        auVar83 = vfmadd231ps_avx512vl(auVar98,local_3a0,auVar96);
        auVar189._8_4_ = 0x7fffffff;
        auVar189._0_8_ = 0x7fffffff7fffffff;
        auVar189._12_4_ = 0x7fffffff;
        auVar189._16_4_ = 0x7fffffff;
        auVar189._20_4_ = 0x7fffffff;
        auVar189._24_4_ = 0x7fffffff;
        auVar189._28_4_ = 0x7fffffff;
        auVar96 = vandps_avx(auVar92,auVar189);
        auVar98 = vandps_avx(auVar81,auVar189);
        auVar98 = vmaxps_avx(auVar96,auVar98);
        auVar96 = vandps_avx(auVar82,auVar189);
        auVar96 = vmaxps_avx(auVar98,auVar96);
        auVar82 = vbroadcastss_avx512vl(ZEXT416((uint)fVar128));
        uVar60 = vcmpps_avx512vl(auVar96,auVar82,1);
        bVar12 = (bool)((byte)uVar60 & 1);
        auVar97._0_4_ = (float)((uint)bVar12 * auVar87._0_4_ | (uint)!bVar12 * auVar92._0_4_);
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar97._4_4_ = (float)((uint)bVar12 * auVar87._4_4_ | (uint)!bVar12 * auVar92._4_4_);
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar97._8_4_ = (float)((uint)bVar12 * auVar87._8_4_ | (uint)!bVar12 * auVar92._8_4_);
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar97._12_4_ = (float)((uint)bVar12 * auVar87._12_4_ | (uint)!bVar12 * auVar92._12_4_);
        bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar97._16_4_ = (float)((uint)bVar12 * auVar87._16_4_ | (uint)!bVar12 * auVar92._16_4_);
        bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar97._20_4_ = (float)((uint)bVar12 * auVar87._20_4_ | (uint)!bVar12 * auVar92._20_4_);
        bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar97._24_4_ = (float)((uint)bVar12 * auVar87._24_4_ | (uint)!bVar12 * auVar92._24_4_);
        bVar12 = SUB81(uVar60 >> 7,0);
        auVar97._28_4_ = (uint)bVar12 * auVar87._28_4_ | (uint)!bVar12 * auVar92._28_4_;
        bVar12 = (bool)((byte)uVar60 & 1);
        auVar99._0_4_ = (float)((uint)bVar12 * auVar88._0_4_ | (uint)!bVar12 * auVar81._0_4_);
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar81._4_4_);
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar81._8_4_);
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar81._12_4_);
        bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar99._16_4_ = (float)((uint)bVar12 * auVar88._16_4_ | (uint)!bVar12 * auVar81._16_4_);
        bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar99._20_4_ = (float)((uint)bVar12 * auVar88._20_4_ | (uint)!bVar12 * auVar81._20_4_);
        bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar99._24_4_ = (float)((uint)bVar12 * auVar88._24_4_ | (uint)!bVar12 * auVar81._24_4_);
        bVar12 = SUB81(uVar60 >> 7,0);
        auVar99._28_4_ = (uint)bVar12 * auVar88._28_4_ | (uint)!bVar12 * auVar81._28_4_;
        auVar96 = vandps_avx(auVar189,auVar94);
        auVar98 = vandps_avx(auVar93,auVar189);
        auVar98 = vmaxps_avx(auVar96,auVar98);
        auVar96 = vandps_avx(auVar83,auVar189);
        auVar96 = vmaxps_avx(auVar98,auVar96);
        uVar60 = vcmpps_avx512vl(auVar96,auVar82,1);
        bVar12 = (bool)((byte)uVar60 & 1);
        auVar100._0_4_ = (float)((uint)bVar12 * auVar87._0_4_ | (uint)!bVar12 * auVar94._0_4_);
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar12 * auVar87._4_4_ | (uint)!bVar12 * auVar94._4_4_);
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar12 * auVar87._8_4_ | (uint)!bVar12 * auVar94._8_4_);
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar12 * auVar87._12_4_ | (uint)!bVar12 * auVar94._12_4_);
        bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar12 * auVar87._16_4_ | (uint)!bVar12 * auVar94._16_4_);
        bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar12 * auVar87._20_4_ | (uint)!bVar12 * auVar94._20_4_);
        bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar12 * auVar87._24_4_ | (uint)!bVar12 * auVar94._24_4_);
        bVar12 = SUB81(uVar60 >> 7,0);
        auVar100._28_4_ = (uint)bVar12 * auVar87._28_4_ | (uint)!bVar12 * auVar94._28_4_;
        bVar12 = (bool)((byte)uVar60 & 1);
        auVar101._0_4_ = (float)((uint)bVar12 * auVar88._0_4_ | (uint)!bVar12 * auVar93._0_4_);
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar93._4_4_);
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar93._8_4_);
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar93._12_4_);
        bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar12 * auVar88._16_4_ | (uint)!bVar12 * auVar93._16_4_);
        bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar12 * auVar88._20_4_ | (uint)!bVar12 * auVar93._20_4_);
        bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar12 * auVar88._24_4_ | (uint)!bVar12 * auVar93._24_4_);
        bVar12 = SUB81(uVar60 >> 7,0);
        auVar101._28_4_ = (uint)bVar12 * auVar88._28_4_ | (uint)!bVar12 * auVar93._28_4_;
        auVar80 = vxorps_avx512vl(auVar76,auVar76);
        auVar196 = ZEXT1664(auVar80);
        auVar96 = vfmadd213ps_avx512vl(auVar97,auVar97,ZEXT1632(auVar80));
        auVar76 = vfmadd231ps_fma(auVar96,auVar99,auVar99);
        auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
        fVar152 = auVar98._0_4_;
        fVar139 = auVar98._4_4_;
        fVar140 = auVar98._8_4_;
        fVar171 = auVar98._12_4_;
        fVar170 = auVar98._16_4_;
        fVar174 = auVar98._20_4_;
        fVar70 = auVar98._24_4_;
        auVar96._4_4_ = fVar139 * fVar139 * fVar139 * auVar76._4_4_ * -0.5;
        auVar96._0_4_ = fVar152 * fVar152 * fVar152 * auVar76._0_4_ * -0.5;
        auVar96._8_4_ = fVar140 * fVar140 * fVar140 * auVar76._8_4_ * -0.5;
        auVar96._12_4_ = fVar171 * fVar171 * fVar171 * auVar76._12_4_ * -0.5;
        auVar96._16_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar96._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
        auVar96._24_4_ = fVar70 * fVar70 * fVar70 * -0.0;
        auVar96._28_4_ = auVar83._28_4_;
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar81,auVar98);
        auVar94._4_4_ = auVar99._4_4_ * auVar96._4_4_;
        auVar94._0_4_ = auVar99._0_4_ * auVar96._0_4_;
        auVar94._8_4_ = auVar99._8_4_ * auVar96._8_4_;
        auVar94._12_4_ = auVar99._12_4_ * auVar96._12_4_;
        auVar94._16_4_ = auVar99._16_4_ * auVar96._16_4_;
        auVar94._20_4_ = auVar99._20_4_ * auVar96._20_4_;
        auVar94._24_4_ = auVar99._24_4_ * auVar96._24_4_;
        auVar94._28_4_ = 0;
        auVar93._4_4_ = auVar96._4_4_ * -auVar97._4_4_;
        auVar93._0_4_ = auVar96._0_4_ * -auVar97._0_4_;
        auVar93._8_4_ = auVar96._8_4_ * -auVar97._8_4_;
        auVar93._12_4_ = auVar96._12_4_ * -auVar97._12_4_;
        auVar93._16_4_ = auVar96._16_4_ * -auVar97._16_4_;
        auVar93._20_4_ = auVar96._20_4_ * -auVar97._20_4_;
        auVar93._24_4_ = auVar96._24_4_ * -auVar97._24_4_;
        auVar93._28_4_ = auVar99._28_4_;
        auVar96 = vmulps_avx512vl(auVar96,ZEXT1632(auVar80));
        auVar87 = ZEXT1632(auVar80);
        auVar98 = vfmadd213ps_avx512vl(auVar100,auVar100,auVar87);
        auVar76 = vfmadd231ps_fma(auVar98,auVar101,auVar101);
        auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
        fVar152 = auVar98._0_4_;
        fVar139 = auVar98._4_4_;
        fVar140 = auVar98._8_4_;
        fVar171 = auVar98._12_4_;
        fVar170 = auVar98._16_4_;
        fVar174 = auVar98._20_4_;
        fVar70 = auVar98._24_4_;
        auVar82._4_4_ = fVar139 * fVar139 * fVar139 * auVar76._4_4_ * -0.5;
        auVar82._0_4_ = fVar152 * fVar152 * fVar152 * auVar76._0_4_ * -0.5;
        auVar82._8_4_ = fVar140 * fVar140 * fVar140 * auVar76._8_4_ * -0.5;
        auVar82._12_4_ = fVar171 * fVar171 * fVar171 * auVar76._12_4_ * -0.5;
        auVar82._16_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar82._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
        auVar82._24_4_ = fVar70 * fVar70 * fVar70 * -0.0;
        auVar82._28_4_ = 0;
        auVar81 = vfmadd231ps_avx512vl(auVar82,auVar81,auVar98);
        auVar92._4_4_ = auVar101._4_4_ * auVar81._4_4_;
        auVar92._0_4_ = auVar101._0_4_ * auVar81._0_4_;
        auVar92._8_4_ = auVar101._8_4_ * auVar81._8_4_;
        auVar92._12_4_ = auVar101._12_4_ * auVar81._12_4_;
        auVar92._16_4_ = auVar101._16_4_ * auVar81._16_4_;
        auVar92._20_4_ = auVar101._20_4_ * auVar81._20_4_;
        auVar92._24_4_ = auVar101._24_4_ * auVar81._24_4_;
        auVar92._28_4_ = auVar98._28_4_;
        auVar83._4_4_ = -auVar100._4_4_ * auVar81._4_4_;
        auVar83._0_4_ = -auVar100._0_4_ * auVar81._0_4_;
        auVar83._8_4_ = -auVar100._8_4_ * auVar81._8_4_;
        auVar83._12_4_ = -auVar100._12_4_ * auVar81._12_4_;
        auVar83._16_4_ = -auVar100._16_4_ * auVar81._16_4_;
        auVar83._20_4_ = -auVar100._20_4_ * auVar81._20_4_;
        auVar83._24_4_ = -auVar100._24_4_ * auVar81._24_4_;
        auVar83._28_4_ = auVar100._28_4_ ^ 0x80000000;
        auVar98 = vmulps_avx512vl(auVar81,auVar87);
        auVar76 = vfmadd213ps_fma(auVar94,auVar89,auVar84);
        auVar75 = vfmadd213ps_fma(auVar93,auVar89,auVar85);
        auVar81 = vfmadd213ps_avx512vl(auVar96,auVar89,auVar95);
        auVar82 = vfmadd213ps_avx512vl(auVar92,ZEXT1632(auVar23),ZEXT1632(auVar21));
        auVar78 = vfnmadd213ps_fma(auVar94,auVar89,auVar84);
        auVar84 = ZEXT1632(auVar23);
        auVar77 = vfmadd213ps_fma(auVar83,auVar84,ZEXT1632(auVar22));
        auVar79 = vfnmadd213ps_fma(auVar93,auVar89,auVar85);
        auVar18 = vfmadd213ps_fma(auVar98,auVar84,auVar91);
        auVar94 = vfnmadd231ps_avx512vl(auVar95,auVar89,auVar96);
        auVar21 = vfnmadd213ps_fma(auVar92,auVar84,ZEXT1632(auVar21));
        auVar22 = vfnmadd213ps_fma(auVar83,auVar84,ZEXT1632(auVar22));
        auVar27 = vfnmadd231ps_fma(auVar91,ZEXT1632(auVar23),auVar98);
        auVar98 = vsubps_avx512vl(auVar82,ZEXT1632(auVar78));
        auVar96 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar79));
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar18),auVar94);
        auVar92 = vmulps_avx512vl(auVar96,auVar94);
        auVar19 = vfmsub231ps_fma(auVar92,ZEXT1632(auVar79),auVar93);
        auVar84._4_4_ = auVar78._4_4_ * auVar93._4_4_;
        auVar84._0_4_ = auVar78._0_4_ * auVar93._0_4_;
        auVar84._8_4_ = auVar78._8_4_ * auVar93._8_4_;
        auVar84._12_4_ = auVar78._12_4_ * auVar93._12_4_;
        auVar84._16_4_ = auVar93._16_4_ * 0.0;
        auVar84._20_4_ = auVar93._20_4_ * 0.0;
        auVar84._24_4_ = auVar93._24_4_ * 0.0;
        auVar84._28_4_ = auVar93._28_4_;
        auVar93 = vfmsub231ps_avx512vl(auVar84,auVar94,auVar98);
        auVar85._4_4_ = auVar79._4_4_ * auVar98._4_4_;
        auVar85._0_4_ = auVar79._0_4_ * auVar98._0_4_;
        auVar85._8_4_ = auVar79._8_4_ * auVar98._8_4_;
        auVar85._12_4_ = auVar79._12_4_ * auVar98._12_4_;
        auVar85._16_4_ = auVar98._16_4_ * 0.0;
        auVar85._20_4_ = auVar98._20_4_ * 0.0;
        auVar85._24_4_ = auVar98._24_4_ * 0.0;
        auVar85._28_4_ = auVar98._28_4_;
        auVar20 = vfmsub231ps_fma(auVar85,ZEXT1632(auVar78),auVar96);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar87,auVar93);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar87,ZEXT1632(auVar19));
        auVar97 = ZEXT1632(auVar80);
        uVar60 = vcmpps_avx512vl(auVar96,auVar97,2);
        bVar59 = (byte)uVar60;
        fVar70 = (float)((uint)(bVar59 & 1) * auVar76._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar21._0_4_);
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        fVar120 = (float)((uint)bVar12 * auVar76._4_4_ | (uint)!bVar12 * auVar21._4_4_);
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        fVar122 = (float)((uint)bVar12 * auVar76._8_4_ | (uint)!bVar12 * auVar21._8_4_);
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        fVar124 = (float)((uint)bVar12 * auVar76._12_4_ | (uint)!bVar12 * auVar21._12_4_);
        auVar92 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar122,CONCAT44(fVar120,fVar70))));
        fVar71 = (float)((uint)(bVar59 & 1) * auVar75._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar22._0_4_);
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        fVar121 = (float)((uint)bVar12 * auVar75._4_4_ | (uint)!bVar12 * auVar22._4_4_);
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        fVar123 = (float)((uint)bVar12 * auVar75._8_4_ | (uint)!bVar12 * auVar22._8_4_);
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        fVar125 = (float)((uint)bVar12 * auVar75._12_4_ | (uint)!bVar12 * auVar22._12_4_);
        auVar83 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar123,CONCAT44(fVar121,fVar71))));
        auVar95._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar27._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar95._4_4_ = (float)((uint)bVar12 * auVar81._4_4_ | (uint)!bVar12 * auVar27._4_4_);
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar95._8_4_ = (float)((uint)bVar12 * auVar81._8_4_ | (uint)!bVar12 * auVar27._8_4_);
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar95._12_4_ = (float)((uint)bVar12 * auVar81._12_4_ | (uint)!bVar12 * auVar27._12_4_);
        fVar152 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar81._16_4_);
        auVar95._16_4_ = fVar152;
        fVar139 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar81._20_4_);
        auVar95._20_4_ = fVar139;
        fVar140 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar81._24_4_);
        auVar95._24_4_ = fVar140;
        iVar1 = (uint)(byte)(uVar60 >> 7) * auVar81._28_4_;
        auVar95._28_4_ = iVar1;
        auVar98 = vblendmps_avx512vl(ZEXT1632(auVar78),auVar82);
        auVar102._0_4_ =
             (uint)(bVar59 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar19._0_4_;
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar102._4_4_ = (uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar19._4_4_;
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar102._8_4_ = (uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar19._8_4_;
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar102._12_4_ = (uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar19._12_4_;
        auVar102._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * auVar98._16_4_;
        auVar102._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * auVar98._20_4_;
        auVar102._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * auVar98._24_4_;
        auVar102._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar98._28_4_;
        auVar98 = vblendmps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar77));
        auVar103._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar75._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar75._4_4_);
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar75._8_4_);
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar75._12_4_);
        fVar174 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar98._16_4_);
        auVar103._16_4_ = fVar174;
        fVar170 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar98._20_4_);
        auVar103._20_4_ = fVar170;
        fVar171 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar98._24_4_);
        auVar103._24_4_ = fVar171;
        auVar103._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar98._28_4_;
        auVar98 = vblendmps_avx512vl(auVar94,ZEXT1632(auVar18));
        auVar104._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar81._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar81._4_4_);
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar81._8_4_);
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar81._12_4_);
        bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * auVar81._16_4_);
        bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * auVar81._20_4_);
        bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * auVar81._24_4_);
        bVar12 = SUB81(uVar60 >> 7,0);
        auVar104._28_4_ = (uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar81._28_4_;
        auVar105._0_4_ =
             (uint)(bVar59 & 1) * (int)auVar78._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar82._0_4_;
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar105._4_4_ = (uint)bVar12 * (int)auVar78._4_4_ | (uint)!bVar12 * auVar82._4_4_;
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar105._8_4_ = (uint)bVar12 * (int)auVar78._8_4_ | (uint)!bVar12 * auVar82._8_4_;
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar105._12_4_ = (uint)bVar12 * (int)auVar78._12_4_ | (uint)!bVar12 * auVar82._12_4_;
        auVar105._16_4_ = (uint)!(bool)((byte)(uVar60 >> 4) & 1) * auVar82._16_4_;
        auVar105._20_4_ = (uint)!(bool)((byte)(uVar60 >> 5) & 1) * auVar82._20_4_;
        auVar105._24_4_ = (uint)!(bool)((byte)(uVar60 >> 6) & 1) * auVar82._24_4_;
        auVar105._28_4_ = (uint)!SUB81(uVar60 >> 7,0) * auVar82._28_4_;
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar106._0_4_ =
             (uint)(bVar59 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar18._0_4_;
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar106._4_4_ = (uint)bVar13 * auVar94._4_4_ | (uint)!bVar13 * auVar18._4_4_;
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar106._8_4_ = (uint)bVar13 * auVar94._8_4_ | (uint)!bVar13 * auVar18._8_4_;
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar106._12_4_ = (uint)bVar13 * auVar94._12_4_ | (uint)!bVar13 * auVar18._12_4_;
        auVar106._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * auVar94._16_4_;
        auVar106._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * auVar94._20_4_;
        auVar106._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * auVar94._24_4_;
        iVar2 = (uint)(byte)(uVar60 >> 7) * auVar94._28_4_;
        auVar106._28_4_ = iVar2;
        auVar84 = vsubps_avx512vl(auVar105,auVar92);
        auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar79._12_4_ |
                                                (uint)!bVar15 * auVar77._12_4_,
                                                CONCAT48((uint)bVar14 * (int)auVar79._8_4_ |
                                                         (uint)!bVar14 * auVar77._8_4_,
                                                         CONCAT44((uint)bVar12 * (int)auVar79._4_4_
                                                                  | (uint)!bVar12 * auVar77._4_4_,
                                                                  (uint)(bVar59 & 1) *
                                                                  (int)auVar79._0_4_ |
                                                                  (uint)!(bool)(bVar59 & 1) *
                                                                  auVar77._0_4_)))),auVar83);
        auVar94 = vsubps_avx(auVar106,auVar95);
        auVar93 = vsubps_avx(auVar92,auVar102);
        auVar81 = vsubps_avx(auVar83,auVar103);
        auVar82 = vsubps_avx(auVar95,auVar104);
        auVar87._4_4_ = auVar94._4_4_ * fVar120;
        auVar87._0_4_ = auVar94._0_4_ * fVar70;
        auVar87._8_4_ = auVar94._8_4_ * fVar122;
        auVar87._12_4_ = auVar94._12_4_ * fVar124;
        auVar87._16_4_ = auVar94._16_4_ * 0.0;
        auVar87._20_4_ = auVar94._20_4_ * 0.0;
        auVar87._24_4_ = auVar94._24_4_ * 0.0;
        auVar87._28_4_ = iVar2;
        auVar76 = vfmsub231ps_fma(auVar87,auVar95,auVar84);
        auVar88._4_4_ = fVar121 * auVar84._4_4_;
        auVar88._0_4_ = fVar71 * auVar84._0_4_;
        auVar88._8_4_ = fVar123 * auVar84._8_4_;
        auVar88._12_4_ = fVar125 * auVar84._12_4_;
        auVar88._16_4_ = auVar84._16_4_ * 0.0;
        auVar88._20_4_ = auVar84._20_4_ * 0.0;
        auVar88._24_4_ = auVar84._24_4_ * 0.0;
        auVar88._28_4_ = auVar96._28_4_;
        auVar75 = vfmsub231ps_fma(auVar88,auVar92,auVar98);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar97,ZEXT1632(auVar76));
        auVar161._0_4_ = auVar98._0_4_ * auVar95._0_4_;
        auVar161._4_4_ = auVar98._4_4_ * auVar95._4_4_;
        auVar161._8_4_ = auVar98._8_4_ * auVar95._8_4_;
        auVar161._12_4_ = auVar98._12_4_ * auVar95._12_4_;
        auVar161._16_4_ = auVar98._16_4_ * fVar152;
        auVar161._20_4_ = auVar98._20_4_ * fVar139;
        auVar161._24_4_ = auVar98._24_4_ * fVar140;
        auVar161._28_4_ = 0;
        auVar76 = vfmsub231ps_fma(auVar161,auVar83,auVar94);
        auVar85 = vfmadd231ps_avx512vl(auVar96,auVar97,ZEXT1632(auVar76));
        auVar96 = vmulps_avx512vl(auVar82,auVar102);
        auVar96 = vfmsub231ps_avx512vl(auVar96,auVar93,auVar104);
        auVar91._4_4_ = auVar81._4_4_ * auVar104._4_4_;
        auVar91._0_4_ = auVar81._0_4_ * auVar104._0_4_;
        auVar91._8_4_ = auVar81._8_4_ * auVar104._8_4_;
        auVar91._12_4_ = auVar81._12_4_ * auVar104._12_4_;
        auVar91._16_4_ = auVar81._16_4_ * auVar104._16_4_;
        auVar91._20_4_ = auVar81._20_4_ * auVar104._20_4_;
        auVar91._24_4_ = auVar81._24_4_ * auVar104._24_4_;
        auVar91._28_4_ = auVar104._28_4_;
        auVar76 = vfmsub231ps_fma(auVar91,auVar103,auVar82);
        auVar162._0_4_ = auVar103._0_4_ * auVar93._0_4_;
        auVar162._4_4_ = auVar103._4_4_ * auVar93._4_4_;
        auVar162._8_4_ = auVar103._8_4_ * auVar93._8_4_;
        auVar162._12_4_ = auVar103._12_4_ * auVar93._12_4_;
        auVar162._16_4_ = fVar174 * auVar93._16_4_;
        auVar162._20_4_ = fVar170 * auVar93._20_4_;
        auVar162._24_4_ = fVar171 * auVar93._24_4_;
        auVar162._28_4_ = 0;
        auVar75 = vfmsub231ps_fma(auVar162,auVar81,auVar102);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar97,auVar96);
        auVar87 = vfmadd231ps_avx512vl(auVar96,auVar97,ZEXT1632(auVar76));
        auVar96 = vmaxps_avx(auVar85,auVar87);
        uVar141 = vcmpps_avx512vl(auVar96,auVar97,2);
        bVar69 = bVar69 & (byte)uVar141;
        auVar197 = ZEXT3264(local_760);
        auVar198 = ZEXT3264(local_780);
        auVar194 = ZEXT3264(local_8c0);
        auVar193 = ZEXT3264(local_8e0);
        if (bVar69 == 0) {
          uVar63 = 0;
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar195 = ZEXT3264(auVar96);
          auVar201 = ZEXT3264(local_800);
          auVar199 = ZEXT3264(local_820);
          auVar138 = ZEXT3264(local_840);
          auVar200 = ZEXT3264(local_860);
        }
        else {
          auVar88 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x200)));
          auVar192 = ZEXT3264(auVar88);
          auVar34._4_4_ = auVar82._4_4_ * auVar98._4_4_;
          auVar34._0_4_ = auVar82._0_4_ * auVar98._0_4_;
          auVar34._8_4_ = auVar82._8_4_ * auVar98._8_4_;
          auVar34._12_4_ = auVar82._12_4_ * auVar98._12_4_;
          auVar34._16_4_ = auVar82._16_4_ * auVar98._16_4_;
          auVar34._20_4_ = auVar82._20_4_ * auVar98._20_4_;
          auVar34._24_4_ = auVar82._24_4_ * auVar98._24_4_;
          auVar34._28_4_ = auVar96._28_4_;
          auVar77 = vfmsub231ps_fma(auVar34,auVar81,auVar94);
          auVar35._4_4_ = auVar94._4_4_ * auVar93._4_4_;
          auVar35._0_4_ = auVar94._0_4_ * auVar93._0_4_;
          auVar35._8_4_ = auVar94._8_4_ * auVar93._8_4_;
          auVar35._12_4_ = auVar94._12_4_ * auVar93._12_4_;
          auVar35._16_4_ = auVar94._16_4_ * auVar93._16_4_;
          auVar35._20_4_ = auVar94._20_4_ * auVar93._20_4_;
          auVar35._24_4_ = auVar94._24_4_ * auVar93._24_4_;
          auVar35._28_4_ = auVar94._28_4_;
          auVar75 = vfmsub231ps_fma(auVar35,auVar84,auVar82);
          auVar36._4_4_ = auVar81._4_4_ * auVar84._4_4_;
          auVar36._0_4_ = auVar81._0_4_ * auVar84._0_4_;
          auVar36._8_4_ = auVar81._8_4_ * auVar84._8_4_;
          auVar36._12_4_ = auVar81._12_4_ * auVar84._12_4_;
          auVar36._16_4_ = auVar81._16_4_ * auVar84._16_4_;
          auVar36._20_4_ = auVar81._20_4_ * auVar84._20_4_;
          auVar36._24_4_ = auVar81._24_4_ * auVar84._24_4_;
          auVar36._28_4_ = auVar81._28_4_;
          auVar18 = vfmsub231ps_fma(auVar36,auVar93,auVar98);
          auVar76 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar75),ZEXT1632(auVar18));
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar77),auVar97);
          auVar98 = vrcp14ps_avx512vl(auVar96);
          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar195 = ZEXT3264(auVar94);
          auVar93 = vfnmadd213ps_avx512vl(auVar98,auVar96,auVar94);
          auVar76 = vfmadd132ps_fma(auVar93,auVar98,auVar98);
          auVar37._4_4_ = auVar18._4_4_ * auVar95._4_4_;
          auVar37._0_4_ = auVar18._0_4_ * auVar95._0_4_;
          auVar37._8_4_ = auVar18._8_4_ * auVar95._8_4_;
          auVar37._12_4_ = auVar18._12_4_ * auVar95._12_4_;
          auVar37._16_4_ = fVar152 * 0.0;
          auVar37._20_4_ = fVar139 * 0.0;
          auVar37._24_4_ = fVar140 * 0.0;
          auVar37._28_4_ = iVar1;
          auVar75 = vfmadd231ps_fma(auVar37,auVar83,ZEXT1632(auVar75));
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar92,ZEXT1632(auVar77));
          fVar152 = auVar76._0_4_;
          fVar139 = auVar76._4_4_;
          fVar140 = auVar76._8_4_;
          fVar171 = auVar76._12_4_;
          local_600 = ZEXT1632(CONCAT412(auVar75._12_4_ * fVar171,
                                         CONCAT48(auVar75._8_4_ * fVar140,
                                                  CONCAT44(auVar75._4_4_ * fVar139,
                                                           auVar75._0_4_ * fVar152))));
          auVar177._4_4_ = uVar66;
          auVar177._0_4_ = uVar66;
          auVar177._8_4_ = uVar66;
          auVar177._12_4_ = uVar66;
          auVar177._16_4_ = uVar66;
          auVar177._20_4_ = uVar66;
          auVar177._24_4_ = uVar66;
          auVar177._28_4_ = uVar66;
          uVar141 = vcmpps_avx512vl(local_600,auVar88,2);
          uVar24 = vcmpps_avx512vl(auVar177,local_600,2);
          bVar69 = (byte)uVar141 & (byte)uVar24 & bVar69;
          auVar201 = ZEXT3264(local_800);
          auVar199 = ZEXT3264(local_820);
          auVar138 = ZEXT3264(local_840);
          auVar200 = ZEXT3264(local_860);
          auVar191 = ZEXT3264(auVar86);
          if (bVar69 != 0) {
            uVar141 = vcmpps_avx512vl(auVar96,auVar97,4);
            bVar69 = bVar69 & (byte)uVar141;
            if (bVar69 != 0) {
              fVar170 = auVar85._0_4_ * fVar152;
              fVar174 = auVar85._4_4_ * fVar139;
              auVar38._4_4_ = fVar174;
              auVar38._0_4_ = fVar170;
              fVar70 = auVar85._8_4_ * fVar140;
              auVar38._8_4_ = fVar70;
              fVar71 = auVar85._12_4_ * fVar171;
              auVar38._12_4_ = fVar71;
              fVar120 = auVar85._16_4_ * 0.0;
              auVar38._16_4_ = fVar120;
              fVar121 = auVar85._20_4_ * 0.0;
              auVar38._20_4_ = fVar121;
              fVar122 = auVar85._24_4_ * 0.0;
              auVar38._24_4_ = fVar122;
              auVar38._28_4_ = auVar96._28_4_;
              auVar98 = vsubps_avx512vl(auVar94,auVar38);
              local_640._0_4_ =
                   (float)((uint)(bVar59 & 1) * (int)fVar170 |
                          (uint)!(bool)(bVar59 & 1) * auVar98._0_4_);
              bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
              local_640._4_4_ = (float)((uint)bVar12 * (int)fVar174 | (uint)!bVar12 * auVar98._4_4_)
              ;
              bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
              local_640._8_4_ = (float)((uint)bVar12 * (int)fVar70 | (uint)!bVar12 * auVar98._8_4_);
              bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
              local_640._12_4_ =
                   (float)((uint)bVar12 * (int)fVar71 | (uint)!bVar12 * auVar98._12_4_);
              bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
              local_640._16_4_ =
                   (float)((uint)bVar12 * (int)fVar120 | (uint)!bVar12 * auVar98._16_4_);
              bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
              local_640._20_4_ =
                   (float)((uint)bVar12 * (int)fVar121 | (uint)!bVar12 * auVar98._20_4_);
              bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
              local_640._24_4_ =
                   (float)((uint)bVar12 * (int)fVar122 | (uint)!bVar12 * auVar98._24_4_);
              bVar12 = SUB81(uVar60 >> 7,0);
              local_640._28_4_ =
                   (float)((uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar98._28_4_);
              auVar96 = vsubps_avx(ZEXT1632(auVar23),auVar89);
              auVar76 = vfmadd213ps_fma(auVar96,local_640,auVar89);
              uVar129 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar89._4_4_ = uVar129;
              auVar89._0_4_ = uVar129;
              auVar89._8_4_ = uVar129;
              auVar89._12_4_ = uVar129;
              auVar89._16_4_ = uVar129;
              auVar89._20_4_ = uVar129;
              auVar89._24_4_ = uVar129;
              auVar89._28_4_ = uVar129;
              auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                                           CONCAT48(auVar76._8_4_ + auVar76._8_4_,
                                                                    CONCAT44(auVar76._4_4_ +
                                                                             auVar76._4_4_,
                                                                             auVar76._0_4_ +
                                                                             auVar76._0_4_)))),
                                        auVar89);
              uVar141 = vcmpps_avx512vl(local_600,auVar96,6);
              if (((byte)uVar141 & bVar69) != 0) {
                auVar157._0_4_ = auVar87._0_4_ * fVar152;
                auVar157._4_4_ = auVar87._4_4_ * fVar139;
                auVar157._8_4_ = auVar87._8_4_ * fVar140;
                auVar157._12_4_ = auVar87._12_4_ * fVar171;
                auVar157._16_4_ = auVar87._16_4_ * 0.0;
                auVar157._20_4_ = auVar87._20_4_ * 0.0;
                auVar157._24_4_ = auVar87._24_4_ * 0.0;
                auVar157._28_4_ = 0;
                auVar96 = vsubps_avx512vl(auVar94,auVar157);
                auVar107._0_4_ =
                     (uint)(bVar59 & 1) * (int)auVar157._0_4_ |
                     (uint)!(bool)(bVar59 & 1) * auVar96._0_4_;
                bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
                auVar107._4_4_ = (uint)bVar12 * (int)auVar157._4_4_ | (uint)!bVar12 * auVar96._4_4_;
                bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
                auVar107._8_4_ = (uint)bVar12 * (int)auVar157._8_4_ | (uint)!bVar12 * auVar96._8_4_;
                bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
                auVar107._12_4_ =
                     (uint)bVar12 * (int)auVar157._12_4_ | (uint)!bVar12 * auVar96._12_4_;
                bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
                auVar107._16_4_ =
                     (uint)bVar12 * (int)auVar157._16_4_ | (uint)!bVar12 * auVar96._16_4_;
                bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
                auVar107._20_4_ =
                     (uint)bVar12 * (int)auVar157._20_4_ | (uint)!bVar12 * auVar96._20_4_;
                bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
                auVar107._24_4_ =
                     (uint)bVar12 * (int)auVar157._24_4_ | (uint)!bVar12 * auVar96._24_4_;
                auVar107._28_4_ = (uint)!SUB81(uVar60 >> 7,0) * auVar96._28_4_;
                auVar31._8_4_ = 0x40000000;
                auVar31._0_8_ = 0x4000000040000000;
                auVar31._12_4_ = 0x40000000;
                auVar31._16_4_ = 0x40000000;
                auVar31._20_4_ = 0x40000000;
                auVar31._24_4_ = 0x40000000;
                auVar31._28_4_ = 0x40000000;
                local_620 = vfmsub132ps_avx512vl(auVar107,auVar94,auVar31);
                local_5e0 = 0;
                local_5d0 = local_870._0_8_;
                uStack_5c8 = local_870._8_8_;
                local_5c0 = local_880._0_8_;
                uStack_5b8 = local_880._8_8_;
                local_5b0 = local_890._0_8_;
                uStack_5a8 = local_890._8_8_;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar63 = CONCAT71((int7)(uVar63 >> 8),1),
                     pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar152 = 1.0 / auVar90._0_4_;
                    local_580[0] = fVar152 * (local_640._0_4_ + 0.0);
                    local_580[1] = fVar152 * (local_640._4_4_ + 1.0);
                    local_580[2] = fVar152 * (local_640._8_4_ + 2.0);
                    local_580[3] = fVar152 * (local_640._12_4_ + 3.0);
                    fStack_570 = fVar152 * (local_640._16_4_ + 4.0);
                    fStack_56c = fVar152 * (local_640._20_4_ + 5.0);
                    fStack_568 = fVar152 * (local_640._24_4_ + 6.0);
                    fStack_564 = local_640._28_4_ + 7.0;
                    local_560 = local_620;
                    local_540 = local_600;
                    uVar60 = 0;
                    uVar64 = (ulong)((byte)uVar141 & bVar69);
                    for (uVar65 = uVar64; (uVar65 & 1) == 0;
                        uVar65 = uVar65 >> 1 | 0x8000000000000000) {
                      uVar60 = uVar60 + 1;
                    }
                    auVar195 = vpbroadcastd_avx512f();
                    _local_440 = vmovdqa64_avx512f(auVar195);
                    auVar195 = vpbroadcastd_avx512f();
                    local_480 = vmovdqa64_avx512f(auVar195);
                    local_7a0 = auVar86;
                    local_740 = auVar88;
                    local_5dc = iVar8;
                    do {
                      auVar77 = auVar196._0_16_;
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[uVar60]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + uVar60 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar60 * 4)
                      ;
                      local_910.context = context->user;
                      fVar171 = local_200._0_4_;
                      fVar139 = 1.0 - fVar171;
                      fVar152 = fVar139 * fVar139 * -3.0;
                      auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139)),
                                                ZEXT416((uint)(fVar171 * fVar139)),
                                                ZEXT416(0xc0000000));
                      auVar75 = vfmsub132ss_fma(ZEXT416((uint)(fVar171 * fVar139)),
                                                ZEXT416((uint)(fVar171 * fVar171)),
                                                ZEXT416(0x40000000));
                      fVar139 = auVar76._0_4_ * 3.0;
                      fVar140 = auVar75._0_4_ * 3.0;
                      fVar171 = fVar171 * fVar171 * 3.0;
                      auVar168._0_4_ = fVar171 * (float)local_710._0_4_;
                      auVar168._4_4_ = fVar171 * (float)local_710._4_4_;
                      auVar168._8_4_ = fVar171 * fStack_708;
                      auVar168._12_4_ = fVar171 * fStack_704;
                      auVar134._4_4_ = fVar140;
                      auVar134._0_4_ = fVar140;
                      auVar134._8_4_ = fVar140;
                      auVar134._12_4_ = fVar140;
                      auVar76 = vfmadd132ps_fma(auVar134,auVar168,local_890);
                      auVar155._4_4_ = fVar139;
                      auVar155._0_4_ = fVar139;
                      auVar155._8_4_ = fVar139;
                      auVar155._12_4_ = fVar139;
                      auVar76 = vfmadd132ps_fma(auVar155,auVar76,local_880);
                      auVar135._4_4_ = fVar152;
                      auVar135._0_4_ = fVar152;
                      auVar135._8_4_ = fVar152;
                      auVar135._12_4_ = fVar152;
                      auVar76 = vfmadd132ps_fma(auVar135,auVar76,local_870);
                      auVar195 = vbroadcastss_avx512f(auVar76);
                      auVar118 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar118,ZEXT1664(auVar76));
                      auVar118 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar118,ZEXT1664(auVar76));
                      local_2c0[0] = (RTCHitN)auVar195[0];
                      local_2c0[1] = (RTCHitN)auVar195[1];
                      local_2c0[2] = (RTCHitN)auVar195[2];
                      local_2c0[3] = (RTCHitN)auVar195[3];
                      local_2c0[4] = (RTCHitN)auVar195[4];
                      local_2c0[5] = (RTCHitN)auVar195[5];
                      local_2c0[6] = (RTCHitN)auVar195[6];
                      local_2c0[7] = (RTCHitN)auVar195[7];
                      local_2c0[8] = (RTCHitN)auVar195[8];
                      local_2c0[9] = (RTCHitN)auVar195[9];
                      local_2c0[10] = (RTCHitN)auVar195[10];
                      local_2c0[0xb] = (RTCHitN)auVar195[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar195[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar195[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar195[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar195[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar195[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar195[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar195[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar195[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar195[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar195[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar195[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar195[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar195[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar195[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar195[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar195[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar195[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar195[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar195[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar195[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar195[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar195[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar195[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar195[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar195[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar195[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar195[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar195[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar195[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar195[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar195[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar195[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar195[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar195[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar195[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar195[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar195[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar195[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar195[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar195[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar195[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar195[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar195[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar195[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar195[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar195[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar195[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar195[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar195[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar195[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar195[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar195[0x3f];
                      local_180 = local_480._0_8_;
                      uStack_178 = local_480._8_8_;
                      uStack_170 = local_480._16_8_;
                      uStack_168 = local_480._24_8_;
                      uStack_160 = local_480._32_8_;
                      uStack_158 = local_480._40_8_;
                      uStack_150 = local_480._48_8_;
                      uStack_148 = local_480._56_8_;
                      auVar195 = vmovdqa64_avx512f(_local_440);
                      local_140 = vmovdqa64_avx512f(auVar195);
                      vpcmpeqd_avx2(auVar195._0_32_,auVar195._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]));
                      auVar118 = vmovdqa64_avx512f(local_300);
                      local_6c0 = vmovdqa64_avx512f(auVar118);
                      local_910.valid = (int *)local_6c0;
                      local_910.geometryUserPtr = pGVar9->userPtr;
                      local_910.hit = local_2c0;
                      local_910.N = 0x10;
                      local_6e0 = (float)uVar64;
                      fStack_6dc = (float)(uVar64 >> 0x20);
                      local_700 = (uint)uVar60;
                      uStack_6fc = (uint)(uVar60 >> 0x20);
                      local_910.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar9->occlusionFilterN)(&local_910);
                        uVar60 = CONCAT44(uStack_6fc,local_700);
                        uVar64 = CONCAT44(fStack_6dc,local_6e0);
                        auVar192 = ZEXT3264(local_740);
                        auVar191 = ZEXT3264(local_7a0);
                        auVar200 = ZEXT3264(local_860);
                        auVar138 = ZEXT3264(local_840);
                        auVar199 = ZEXT3264(local_820);
                        auVar201 = ZEXT3264(local_800);
                        auVar193 = ZEXT3264(local_8e0);
                        auVar194 = ZEXT3264(local_8c0);
                        auVar198 = ZEXT3264(local_780);
                        auVar197 = ZEXT3264(local_760);
                        auVar76 = vxorps_avx512vl(auVar77,auVar77);
                        auVar196 = ZEXT1664(auVar76);
                        auVar118 = vmovdqa64_avx512f(local_6c0);
                        uVar66 = local_7c0._0_4_;
                      }
                      auVar76 = auVar196._0_16_;
                      uVar141 = vptestmd_avx512f(auVar118,auVar118);
                      if ((short)uVar141 == 0) {
                        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar195 = ZEXT3264(auVar96);
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if (p_Var11 == (RTCFilterFunctionN)0x0) {
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar195 = ZEXT3264(auVar96);
                        }
                        else {
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar195 = ZEXT3264(auVar96);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var11)(&local_910);
                            uVar60 = CONCAT44(uStack_6fc,local_700);
                            uVar64 = CONCAT44(fStack_6dc,local_6e0);
                            auVar192 = ZEXT3264(local_740);
                            auVar191 = ZEXT3264(local_7a0);
                            auVar200 = ZEXT3264(local_860);
                            auVar138 = ZEXT3264(local_840);
                            auVar199 = ZEXT3264(local_820);
                            auVar201 = ZEXT3264(local_800);
                            auVar193 = ZEXT3264(local_8e0);
                            auVar194 = ZEXT3264(local_8c0);
                            auVar198 = ZEXT3264(local_780);
                            auVar197 = ZEXT3264(local_760);
                            auVar76 = vxorps_avx512vl(auVar76,auVar76);
                            auVar196 = ZEXT1664(auVar76);
                            auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar195 = ZEXT3264(auVar96);
                            auVar118 = vmovdqa64_avx512f(local_6c0);
                            uVar66 = local_7c0._0_4_;
                          }
                        }
                        auVar86 = auVar191._0_32_;
                        uVar65 = vptestmd_avx512f(auVar118,auVar118);
                        auVar118 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar12 = (bool)((byte)uVar65 & 1);
                        auVar119._0_4_ =
                             (uint)bVar12 * auVar118._0_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x200);
                        bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
                        auVar119._4_4_ =
                             (uint)bVar12 * auVar118._4_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x204);
                        bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
                        auVar119._8_4_ =
                             (uint)bVar12 * auVar118._8_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x208);
                        bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
                        auVar119._12_4_ =
                             (uint)bVar12 * auVar118._12_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x20c);
                        bVar12 = (bool)((byte)(uVar65 >> 4) & 1);
                        auVar119._16_4_ =
                             (uint)bVar12 * auVar118._16_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x210);
                        bVar12 = (bool)((byte)(uVar65 >> 5) & 1);
                        auVar119._20_4_ =
                             (uint)bVar12 * auVar118._20_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x214);
                        bVar12 = (bool)((byte)(uVar65 >> 6) & 1);
                        auVar119._24_4_ =
                             (uint)bVar12 * auVar118._24_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x218);
                        bVar12 = (bool)((byte)(uVar65 >> 7) & 1);
                        auVar119._28_4_ =
                             (uint)bVar12 * auVar118._28_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x21c);
                        bVar12 = (bool)((byte)(uVar65 >> 8) & 1);
                        auVar119._32_4_ =
                             (uint)bVar12 * auVar118._32_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x220);
                        bVar12 = (bool)((byte)(uVar65 >> 9) & 1);
                        auVar119._36_4_ =
                             (uint)bVar12 * auVar118._36_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x224);
                        bVar12 = (bool)((byte)(uVar65 >> 10) & 1);
                        auVar119._40_4_ =
                             (uint)bVar12 * auVar118._40_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x228);
                        bVar12 = (bool)((byte)(uVar65 >> 0xb) & 1);
                        auVar119._44_4_ =
                             (uint)bVar12 * auVar118._44_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x22c);
                        bVar12 = (bool)((byte)(uVar65 >> 0xc) & 1);
                        auVar119._48_4_ =
                             (uint)bVar12 * auVar118._48_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x230);
                        bVar12 = (bool)((byte)(uVar65 >> 0xd) & 1);
                        auVar119._52_4_ =
                             (uint)bVar12 * auVar118._52_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x234);
                        bVar12 = (bool)((byte)(uVar65 >> 0xe) & 1);
                        auVar119._56_4_ =
                             (uint)bVar12 * auVar118._56_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x238);
                        bVar12 = SUB81(uVar65 >> 0xf,0);
                        auVar119._60_4_ =
                             (uint)bVar12 * auVar118._60_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x23c);
                        *(undefined1 (*) [64])(local_910.ray + 0x200) = auVar119;
                        if ((short)uVar65 != 0) {
                          uVar63 = CONCAT71((int7)(uVar63 >> 8),1);
                          break;
                        }
                      }
                      auVar86 = auVar191._0_32_;
                      *(int *)(ray + k * 4 + 0x200) = auVar192._0_4_;
                      uVar65 = uVar60 & 0x3f;
                      uVar63 = 0;
                      uVar60 = 0;
                      uVar64 = uVar64 ^ 1L << uVar65;
                      for (uVar65 = uVar64; (uVar65 & 1) == 0;
                          uVar65 = uVar65 >> 1 | 0x8000000000000000) {
                        uVar60 = uVar60 + 1;
                      }
                    } while (uVar64 != 0);
                  }
                  goto LAB_01b861b1;
                }
              }
            }
          }
          uVar63 = 0;
        }
      }
LAB_01b861b1:
      auVar191 = _local_440;
      if (8 < iVar8) {
        local_7c0 = vpbroadcastd_avx512vl();
        local_440._4_4_ = 1.0 / (float)local_500._0_4_;
        local_440._0_4_ = local_440._4_4_;
        fStack_438 = (float)local_440._4_4_;
        fStack_434 = (float)local_440._4_4_;
        fStack_430 = (float)local_440._4_4_;
        fStack_42c = (float)local_440._4_4_;
        fStack_428 = (float)local_440._4_4_;
        auStack_420 = auVar191._32_32_;
        fStack_424 = (float)local_440._4_4_;
        auVar191 = vpbroadcastd_avx512f();
        local_500 = vmovdqa64_avx512f(auVar191);
        auVar191 = vpbroadcastd_avx512f();
        local_4c0 = vmovdqa64_avx512f(auVar191);
        lVar67 = 8;
        local_7a0 = auVar86;
        local_700 = uVar66;
        uStack_6fc = uVar66;
        uStack_6f8 = uVar66;
        uStack_6f4 = uVar66;
        uStack_6f0 = uVar66;
        uStack_6ec = uVar66;
        uStack_6e8 = uVar66;
        uStack_6e4 = uVar66;
        local_6e0 = fVar128;
        fStack_6dc = fVar128;
        fStack_6d8 = fVar128;
        fStack_6d4 = fVar128;
        fStack_6d0 = fVar128;
        fStack_6cc = fVar128;
        fStack_6c8 = fVar128;
        fStack_6c4 = fVar128;
        do {
          auVar96 = vpbroadcastd_avx512vl();
          auVar81 = vpor_avx2(auVar96,_DAT_01fe9900);
          uVar24 = vpcmpd_avx512vl(auVar81,local_7c0,1);
          auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 * 4 + lVar25);
          auVar98 = *(undefined1 (*) [32])(lVar25 + 0x21aa768 + lVar67 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar25 + 0x21aabec + lVar67 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar25 + 0x21ab070 + lVar67 * 4);
          local_840 = auVar138._0_32_;
          auVar82 = vmulps_avx512vl(local_840,auVar93);
          local_860 = auVar200._0_32_;
          auVar92 = vmulps_avx512vl(local_860,auVar93);
          auVar39._4_4_ = auVar93._4_4_ * (float)local_380._4_4_;
          auVar39._0_4_ = auVar93._0_4_ * (float)local_380._0_4_;
          auVar39._8_4_ = auVar93._8_4_ * fStack_378;
          auVar39._12_4_ = auVar93._12_4_ * fStack_374;
          auVar39._16_4_ = auVar93._16_4_ * fStack_370;
          auVar39._20_4_ = auVar93._20_4_ * fStack_36c;
          auVar39._24_4_ = auVar93._24_4_ * fStack_368;
          auVar39._28_4_ = auVar81._28_4_;
          local_800 = auVar201._0_32_;
          auVar81 = vfmadd231ps_avx512vl(auVar82,auVar94,local_800);
          local_820 = auVar199._0_32_;
          auVar82 = vfmadd231ps_avx512vl(auVar92,auVar94,local_820);
          auVar92 = vfmadd231ps_avx512vl(auVar39,auVar94,local_360);
          auVar99 = auVar194._0_32_;
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar98,auVar99);
          auVar97 = auVar193._0_32_;
          auVar82 = vfmadd231ps_avx512vl(auVar82,auVar98,auVar97);
          auVar76 = vfmadd231ps_fma(auVar92,auVar98,local_340);
          auVar100 = auVar197._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar81,auVar96,auVar100);
          auVar101 = auVar198._0_32_;
          auVar87 = vfmadd231ps_avx512vl(auVar82,auVar96,auVar101);
          auVar81 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 * 4 + lVar25);
          auVar82 = *(undefined1 (*) [32])(lVar25 + 0x21acb88 + lVar67 * 4);
          auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar96,local_320);
          auVar92 = *(undefined1 (*) [32])(lVar25 + 0x21ad00c + lVar67 * 4);
          auVar83 = *(undefined1 (*) [32])(lVar25 + 0x21ad490 + lVar67 * 4);
          auVar86 = vmulps_avx512vl(local_840,auVar83);
          auVar84 = vmulps_avx512vl(local_860,auVar83);
          auVar40._4_4_ = auVar83._4_4_ * (float)local_380._4_4_;
          auVar40._0_4_ = auVar83._0_4_ * (float)local_380._0_4_;
          auVar40._8_4_ = auVar83._8_4_ * fStack_378;
          auVar40._12_4_ = auVar83._12_4_ * fStack_374;
          auVar40._16_4_ = auVar83._16_4_ * fStack_370;
          auVar40._20_4_ = auVar83._20_4_ * fStack_36c;
          auVar40._24_4_ = auVar83._24_4_ * fStack_368;
          auVar40._28_4_ = uStack_364;
          auVar86 = vfmadd231ps_avx512vl(auVar86,auVar92,local_800);
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar92,local_820);
          auVar88 = vfmadd231ps_avx512vl(auVar40,auVar92,local_360);
          auVar86 = vfmadd231ps_avx512vl(auVar86,auVar82,auVar99);
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar82,auVar97);
          auVar75 = vfmadd231ps_fma(auVar88,auVar82,local_340);
          auVar88 = vfmadd231ps_avx512vl(auVar86,auVar81,auVar100);
          auVar89 = vfmadd231ps_avx512vl(auVar84,auVar81,auVar101);
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar81,local_320);
          auVar90 = vmaxps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar75));
          auVar86 = vsubps_avx(auVar88,auVar85);
          auVar84 = vsubps_avx(auVar89,auVar87);
          auVar91 = vmulps_avx512vl(auVar87,auVar86);
          auVar95 = vmulps_avx512vl(auVar85,auVar84);
          auVar91 = vsubps_avx512vl(auVar91,auVar95);
          auVar95 = vmulps_avx512vl(auVar84,auVar84);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar86,auVar86);
          auVar90 = vmulps_avx512vl(auVar90,auVar90);
          auVar90 = vmulps_avx512vl(auVar90,auVar95);
          auVar91 = vmulps_avx512vl(auVar91,auVar91);
          uVar141 = vcmpps_avx512vl(auVar91,auVar90,2);
          bVar69 = (byte)uVar24 & (byte)uVar141;
          if (bVar69 == 0) {
            auVar194 = ZEXT3264(auVar99);
            auVar193 = ZEXT3264(auVar97);
          }
          else {
            auVar83 = vmulps_avx512vl(local_7a0,auVar83);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_3e0,auVar83);
            auVar82 = vfmadd213ps_avx512vl(auVar82,local_3c0,auVar92);
            auVar81 = vfmadd213ps_avx512vl(auVar81,local_3a0,auVar82);
            auVar93 = vmulps_avx512vl(local_7a0,auVar93);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_3e0,auVar93);
            auVar98 = vfmadd213ps_avx512vl(auVar98,local_3c0,auVar94);
            auVar82 = vfmadd213ps_avx512vl(auVar96,local_3a0,auVar98);
            auVar96 = *(undefined1 (*) [32])(lVar25 + 0x21ab4f4 + lVar67 * 4);
            auVar98 = *(undefined1 (*) [32])(lVar25 + 0x21ab978 + lVar67 * 4);
            auVar94 = *(undefined1 (*) [32])(lVar25 + 0x21abdfc + lVar67 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar25 + 0x21ac280 + lVar67 * 4);
            auVar92 = vmulps_avx512vl(local_840,auVar93);
            auVar83 = vmulps_avx512vl(local_860,auVar93);
            auVar93 = vmulps_avx512vl(local_7a0,auVar93);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar94,local_800);
            auVar83 = vfmadd231ps_avx512vl(auVar83,auVar94,local_820);
            auVar94 = vfmadd231ps_avx512vl(auVar93,local_3e0,auVar94);
            auVar93 = vfmadd231ps_avx512vl(auVar92,auVar98,auVar99);
            auVar92 = vfmadd231ps_avx512vl(auVar83,auVar98,auVar97);
            auVar98 = vfmadd231ps_avx512vl(auVar94,local_3c0,auVar98);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,auVar100);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar101);
            auVar83 = vfmadd231ps_avx512vl(auVar98,local_3a0,auVar96);
            auVar96 = *(undefined1 (*) [32])(lVar25 + 0x21ad914 + lVar67 * 4);
            auVar98 = *(undefined1 (*) [32])(lVar25 + 0x21ae21c + lVar67 * 4);
            auVar94 = *(undefined1 (*) [32])(lVar25 + 0x21ae6a0 + lVar67 * 4);
            auVar90 = vmulps_avx512vl(local_840,auVar94);
            auVar91 = vmulps_avx512vl(local_860,auVar94);
            auVar94 = vmulps_avx512vl(local_7a0,auVar94);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar98,local_800);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar98,local_820);
            auVar94 = vfmadd231ps_avx512vl(auVar94,local_3e0,auVar98);
            auVar98 = *(undefined1 (*) [32])(lVar25 + 0x21add98 + lVar67 * 4);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar98,auVar99);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar98,auVar97);
            auVar98 = vfmadd231ps_avx512vl(auVar94,local_3c0,auVar98);
            auVar94 = vfmadd231ps_avx512vl(auVar90,auVar96,auVar100);
            auVar90 = vfmadd231ps_avx512vl(auVar91,auVar96,auVar101);
            auVar98 = vfmadd231ps_avx512vl(auVar98,local_3a0,auVar96);
            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar93,auVar91);
            vandps_avx512vl(auVar92,auVar91);
            auVar96 = vmaxps_avx(auVar91,auVar91);
            vandps_avx512vl(auVar83,auVar91);
            auVar96 = vmaxps_avx(auVar96,auVar91);
            auVar58._4_4_ = fStack_6dc;
            auVar58._0_4_ = local_6e0;
            auVar58._8_4_ = fStack_6d8;
            auVar58._12_4_ = fStack_6d4;
            auVar58._16_4_ = fStack_6d0;
            auVar58._20_4_ = fStack_6cc;
            auVar58._24_4_ = fStack_6c8;
            auVar58._28_4_ = fStack_6c4;
            uVar60 = vcmpps_avx512vl(auVar96,auVar58,1);
            bVar12 = (bool)((byte)uVar60 & 1);
            auVar108._0_4_ = (float)((uint)bVar12 * auVar86._0_4_ | (uint)!bVar12 * auVar93._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar108._4_4_ = (float)((uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar93._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar108._8_4_ = (float)((uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar93._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar108._12_4_ =
                 (float)((uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar93._12_4_);
            bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar108._16_4_ =
                 (float)((uint)bVar12 * auVar86._16_4_ | (uint)!bVar12 * auVar93._16_4_);
            bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar108._20_4_ =
                 (float)((uint)bVar12 * auVar86._20_4_ | (uint)!bVar12 * auVar93._20_4_);
            bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar108._24_4_ =
                 (float)((uint)bVar12 * auVar86._24_4_ | (uint)!bVar12 * auVar93._24_4_);
            bVar12 = SUB81(uVar60 >> 7,0);
            auVar108._28_4_ = (uint)bVar12 * auVar86._28_4_ | (uint)!bVar12 * auVar93._28_4_;
            bVar12 = (bool)((byte)uVar60 & 1);
            auVar109._0_4_ = (float)((uint)bVar12 * auVar84._0_4_ | (uint)!bVar12 * auVar92._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar109._4_4_ = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar92._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar109._8_4_ = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar92._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar109._12_4_ =
                 (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar92._12_4_);
            bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar109._16_4_ =
                 (float)((uint)bVar12 * auVar84._16_4_ | (uint)!bVar12 * auVar92._16_4_);
            bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar109._20_4_ =
                 (float)((uint)bVar12 * auVar84._20_4_ | (uint)!bVar12 * auVar92._20_4_);
            bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar109._24_4_ =
                 (float)((uint)bVar12 * auVar84._24_4_ | (uint)!bVar12 * auVar92._24_4_);
            bVar12 = SUB81(uVar60 >> 7,0);
            auVar109._28_4_ = (uint)bVar12 * auVar84._28_4_ | (uint)!bVar12 * auVar92._28_4_;
            vandps_avx512vl(auVar94,auVar91);
            vandps_avx512vl(auVar90,auVar91);
            auVar96 = vmaxps_avx(auVar109,auVar109);
            vandps_avx512vl(auVar98,auVar91);
            auVar96 = vmaxps_avx(auVar96,auVar109);
            uVar60 = vcmpps_avx512vl(auVar96,auVar58,1);
            bVar12 = (bool)((byte)uVar60 & 1);
            auVar110._0_4_ = (uint)bVar12 * auVar86._0_4_ | (uint)!bVar12 * auVar94._0_4_;
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar110._4_4_ = (uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar94._4_4_;
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar110._8_4_ = (uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar94._8_4_;
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar110._12_4_ = (uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar94._12_4_;
            bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar110._16_4_ = (uint)bVar12 * auVar86._16_4_ | (uint)!bVar12 * auVar94._16_4_;
            bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar110._20_4_ = (uint)bVar12 * auVar86._20_4_ | (uint)!bVar12 * auVar94._20_4_;
            bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar110._24_4_ = (uint)bVar12 * auVar86._24_4_ | (uint)!bVar12 * auVar94._24_4_;
            bVar12 = SUB81(uVar60 >> 7,0);
            auVar110._28_4_ = (uint)bVar12 * auVar86._28_4_ | (uint)!bVar12 * auVar94._28_4_;
            bVar12 = (bool)((byte)uVar60 & 1);
            auVar111._0_4_ = (float)((uint)bVar12 * auVar84._0_4_ | (uint)!bVar12 * auVar90._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar90._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar90._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar90._12_4_);
            bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar111._16_4_ =
                 (float)((uint)bVar12 * auVar84._16_4_ | (uint)!bVar12 * auVar90._16_4_);
            bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar111._20_4_ =
                 (float)((uint)bVar12 * auVar84._20_4_ | (uint)!bVar12 * auVar90._20_4_);
            bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar111._24_4_ =
                 (float)((uint)bVar12 * auVar84._24_4_ | (uint)!bVar12 * auVar90._24_4_);
            bVar12 = SUB81(uVar60 >> 7,0);
            auVar111._28_4_ = (uint)bVar12 * auVar84._28_4_ | (uint)!bVar12 * auVar90._28_4_;
            auVar181._8_4_ = 0x80000000;
            auVar181._0_8_ = 0x8000000080000000;
            auVar181._12_4_ = 0x80000000;
            auVar181._16_4_ = 0x80000000;
            auVar181._20_4_ = 0x80000000;
            auVar181._24_4_ = 0x80000000;
            auVar181._28_4_ = 0x80000000;
            auVar96 = vxorps_avx512vl(auVar110,auVar181);
            auVar90 = auVar196._0_32_;
            auVar98 = vfmadd213ps_avx512vl(auVar108,auVar108,auVar90);
            auVar77 = vfmadd231ps_fma(auVar98,auVar109,auVar109);
            auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
            auVar190._8_4_ = 0xbf000000;
            auVar190._0_8_ = 0xbf000000bf000000;
            auVar190._12_4_ = 0xbf000000;
            auVar190._16_4_ = 0xbf000000;
            auVar190._20_4_ = 0xbf000000;
            auVar190._24_4_ = 0xbf000000;
            auVar190._28_4_ = 0xbf000000;
            fVar128 = auVar98._0_4_;
            fVar152 = auVar98._4_4_;
            fVar139 = auVar98._8_4_;
            fVar140 = auVar98._12_4_;
            fVar171 = auVar98._16_4_;
            fVar170 = auVar98._20_4_;
            fVar174 = auVar98._24_4_;
            auVar41._4_4_ = fVar152 * fVar152 * fVar152 * auVar77._4_4_ * -0.5;
            auVar41._0_4_ = fVar128 * fVar128 * fVar128 * auVar77._0_4_ * -0.5;
            auVar41._8_4_ = fVar139 * fVar139 * fVar139 * auVar77._8_4_ * -0.5;
            auVar41._12_4_ = fVar140 * fVar140 * fVar140 * auVar77._12_4_ * -0.5;
            auVar41._16_4_ = fVar171 * fVar171 * fVar171 * -0.0;
            auVar41._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar41._24_4_ = fVar174 * fVar174 * fVar174 * -0.0;
            auVar41._28_4_ = auVar109._28_4_;
            auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar98 = vfmadd231ps_avx512vl(auVar41,auVar94,auVar98);
            auVar42._4_4_ = auVar109._4_4_ * auVar98._4_4_;
            auVar42._0_4_ = auVar109._0_4_ * auVar98._0_4_;
            auVar42._8_4_ = auVar109._8_4_ * auVar98._8_4_;
            auVar42._12_4_ = auVar109._12_4_ * auVar98._12_4_;
            auVar42._16_4_ = auVar109._16_4_ * auVar98._16_4_;
            auVar42._20_4_ = auVar109._20_4_ * auVar98._20_4_;
            auVar42._24_4_ = auVar109._24_4_ * auVar98._24_4_;
            auVar42._28_4_ = 0;
            auVar43._4_4_ = auVar98._4_4_ * -auVar108._4_4_;
            auVar43._0_4_ = auVar98._0_4_ * -auVar108._0_4_;
            auVar43._8_4_ = auVar98._8_4_ * -auVar108._8_4_;
            auVar43._12_4_ = auVar98._12_4_ * -auVar108._12_4_;
            auVar43._16_4_ = auVar98._16_4_ * -auVar108._16_4_;
            auVar43._20_4_ = auVar98._20_4_ * -auVar108._20_4_;
            auVar43._24_4_ = auVar98._24_4_ * -auVar108._24_4_;
            auVar43._28_4_ = auVar109._28_4_;
            auVar93 = vmulps_avx512vl(auVar98,auVar90);
            auVar98 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar90);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar111,auVar111);
            auVar92 = vrsqrt14ps_avx512vl(auVar98);
            auVar98 = vmulps_avx512vl(auVar98,auVar190);
            fVar128 = auVar92._0_4_;
            fVar152 = auVar92._4_4_;
            fVar139 = auVar92._8_4_;
            fVar140 = auVar92._12_4_;
            fVar171 = auVar92._16_4_;
            fVar170 = auVar92._20_4_;
            fVar174 = auVar92._24_4_;
            auVar44._4_4_ = fVar152 * fVar152 * fVar152 * auVar98._4_4_;
            auVar44._0_4_ = fVar128 * fVar128 * fVar128 * auVar98._0_4_;
            auVar44._8_4_ = fVar139 * fVar139 * fVar139 * auVar98._8_4_;
            auVar44._12_4_ = fVar140 * fVar140 * fVar140 * auVar98._12_4_;
            auVar44._16_4_ = fVar171 * fVar171 * fVar171 * auVar98._16_4_;
            auVar44._20_4_ = fVar170 * fVar170 * fVar170 * auVar98._20_4_;
            auVar44._24_4_ = fVar174 * fVar174 * fVar174 * auVar98._24_4_;
            auVar44._28_4_ = auVar98._28_4_;
            auVar98 = vfmadd231ps_avx512vl(auVar44,auVar94,auVar92);
            auVar45._4_4_ = auVar111._4_4_ * auVar98._4_4_;
            auVar45._0_4_ = auVar111._0_4_ * auVar98._0_4_;
            auVar45._8_4_ = auVar111._8_4_ * auVar98._8_4_;
            auVar45._12_4_ = auVar111._12_4_ * auVar98._12_4_;
            auVar45._16_4_ = auVar111._16_4_ * auVar98._16_4_;
            auVar45._20_4_ = auVar111._20_4_ * auVar98._20_4_;
            auVar45._24_4_ = auVar111._24_4_ * auVar98._24_4_;
            auVar45._28_4_ = auVar92._28_4_;
            auVar46._4_4_ = auVar98._4_4_ * auVar96._4_4_;
            auVar46._0_4_ = auVar98._0_4_ * auVar96._0_4_;
            auVar46._8_4_ = auVar98._8_4_ * auVar96._8_4_;
            auVar46._12_4_ = auVar98._12_4_ * auVar96._12_4_;
            auVar46._16_4_ = auVar98._16_4_ * auVar96._16_4_;
            auVar46._20_4_ = auVar98._20_4_ * auVar96._20_4_;
            auVar46._24_4_ = auVar98._24_4_ * auVar96._24_4_;
            auVar46._28_4_ = auVar96._28_4_;
            auVar96 = vmulps_avx512vl(auVar98,auVar90);
            auVar77 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar76),auVar85);
            auVar98 = ZEXT1632(auVar76);
            auVar18 = vfmadd213ps_fma(auVar43,auVar98,auVar87);
            auVar94 = vfmadd213ps_avx512vl(auVar93,auVar98,auVar82);
            auVar92 = vfmadd213ps_avx512vl(auVar45,ZEXT1632(auVar75),auVar88);
            auVar23 = vfnmadd213ps_fma(auVar42,auVar98,auVar85);
            auVar83 = ZEXT1632(auVar75);
            auVar19 = vfmadd213ps_fma(auVar46,auVar83,auVar89);
            auVar78 = vfnmadd213ps_fma(auVar43,auVar98,auVar87);
            auVar20 = vfmadd213ps_fma(auVar96,auVar83,auVar81);
            auVar87 = ZEXT1632(auVar76);
            auVar80 = vfnmadd231ps_fma(auVar82,auVar87,auVar93);
            auVar79 = vfnmadd213ps_fma(auVar45,auVar83,auVar88);
            auVar27 = vfnmadd213ps_fma(auVar46,auVar83,auVar89);
            auVar28 = vfnmadd231ps_fma(auVar81,ZEXT1632(auVar75),auVar96);
            auVar81 = vsubps_avx512vl(auVar92,ZEXT1632(auVar23));
            auVar96 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar78));
            auVar98 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar80));
            auVar47._4_4_ = auVar96._4_4_ * auVar80._4_4_;
            auVar47._0_4_ = auVar96._0_4_ * auVar80._0_4_;
            auVar47._8_4_ = auVar96._8_4_ * auVar80._8_4_;
            auVar47._12_4_ = auVar96._12_4_ * auVar80._12_4_;
            auVar47._16_4_ = auVar96._16_4_ * 0.0;
            auVar47._20_4_ = auVar96._20_4_ * 0.0;
            auVar47._24_4_ = auVar96._24_4_ * 0.0;
            auVar47._28_4_ = auVar93._28_4_;
            auVar76 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar78),auVar98);
            auVar48._4_4_ = auVar98._4_4_ * auVar23._4_4_;
            auVar48._0_4_ = auVar98._0_4_ * auVar23._0_4_;
            auVar48._8_4_ = auVar98._8_4_ * auVar23._8_4_;
            auVar48._12_4_ = auVar98._12_4_ * auVar23._12_4_;
            auVar48._16_4_ = auVar98._16_4_ * 0.0;
            auVar48._20_4_ = auVar98._20_4_ * 0.0;
            auVar48._24_4_ = auVar98._24_4_ * 0.0;
            auVar48._28_4_ = auVar98._28_4_;
            auVar21 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar80),auVar81);
            auVar49._4_4_ = auVar78._4_4_ * auVar81._4_4_;
            auVar49._0_4_ = auVar78._0_4_ * auVar81._0_4_;
            auVar49._8_4_ = auVar78._8_4_ * auVar81._8_4_;
            auVar49._12_4_ = auVar78._12_4_ * auVar81._12_4_;
            auVar49._16_4_ = auVar81._16_4_ * 0.0;
            auVar49._20_4_ = auVar81._20_4_ * 0.0;
            auVar49._24_4_ = auVar81._24_4_ * 0.0;
            auVar49._28_4_ = auVar81._28_4_;
            auVar22 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar23),auVar96);
            auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar90,ZEXT1632(auVar21));
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar76));
            uVar60 = vcmpps_avx512vl(auVar96,auVar90,2);
            bVar59 = (byte)uVar60;
            fVar120 = (float)((uint)(bVar59 & 1) * auVar77._0_4_ |
                             (uint)!(bool)(bVar59 & 1) * auVar79._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            fVar122 = (float)((uint)bVar12 * auVar77._4_4_ | (uint)!bVar12 * auVar79._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            fVar124 = (float)((uint)bVar12 * auVar77._8_4_ | (uint)!bVar12 * auVar79._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            fVar126 = (float)((uint)bVar12 * auVar77._12_4_ | (uint)!bVar12 * auVar79._12_4_);
            auVar83 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar124,CONCAT44(fVar122,fVar120))));
            fVar121 = (float)((uint)(bVar59 & 1) * auVar18._0_4_ |
                             (uint)!(bool)(bVar59 & 1) * auVar27._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            fVar123 = (float)((uint)bVar12 * auVar18._4_4_ | (uint)!bVar12 * auVar27._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            fVar125 = (float)((uint)bVar12 * auVar18._8_4_ | (uint)!bVar12 * auVar27._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            fVar127 = (float)((uint)bVar12 * auVar18._12_4_ | (uint)!bVar12 * auVar27._12_4_);
            auVar86 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar125,CONCAT44(fVar123,fVar121))));
            auVar112._0_4_ =
                 (float)((uint)(bVar59 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar28._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar28._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar28._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar28._12_4_);
            fVar128 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar94._16_4_);
            auVar112._16_4_ = fVar128;
            fVar152 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar94._20_4_);
            auVar112._20_4_ = fVar152;
            fVar139 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar94._24_4_);
            auVar112._24_4_ = fVar139;
            iVar1 = (uint)(byte)(uVar60 >> 7) * auVar94._28_4_;
            auVar112._28_4_ = iVar1;
            auVar96 = vblendmps_avx512vl(ZEXT1632(auVar23),auVar92);
            auVar113._0_4_ =
                 (uint)(bVar59 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar76._0_4_;
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar113._4_4_ = (uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar76._4_4_;
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar113._8_4_ = (uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar76._8_4_;
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar113._12_4_ = (uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar76._12_4_;
            auVar113._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * auVar96._16_4_;
            auVar113._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * auVar96._20_4_;
            auVar113._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * auVar96._24_4_;
            auVar113._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar96._28_4_;
            auVar96 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar19));
            auVar114._0_4_ =
                 (float)((uint)(bVar59 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar77._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar77._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar77._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar77._12_4_);
            fVar170 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar96._16_4_);
            auVar114._16_4_ = fVar170;
            fVar171 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar96._20_4_);
            auVar114._20_4_ = fVar171;
            fVar140 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar96._24_4_);
            auVar114._24_4_ = fVar140;
            auVar114._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar96._28_4_;
            auVar96 = vblendmps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar20));
            auVar115._0_4_ =
                 (float)((uint)(bVar59 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar18._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar18._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar18._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar18._12_4_);
            fVar71 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar96._16_4_);
            auVar115._16_4_ = fVar71;
            fVar70 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar96._20_4_);
            auVar115._20_4_ = fVar70;
            fVar174 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar96._24_4_);
            auVar115._24_4_ = fVar174;
            iVar2 = (uint)(byte)(uVar60 >> 7) * auVar96._28_4_;
            auVar115._28_4_ = iVar2;
            auVar116._0_4_ =
                 (uint)(bVar59 & 1) * (int)auVar23._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar92._0_4_
            ;
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar116._4_4_ = (uint)bVar12 * (int)auVar23._4_4_ | (uint)!bVar12 * auVar92._4_4_;
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar116._8_4_ = (uint)bVar12 * (int)auVar23._8_4_ | (uint)!bVar12 * auVar92._8_4_;
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar116._12_4_ = (uint)bVar12 * (int)auVar23._12_4_ | (uint)!bVar12 * auVar92._12_4_;
            auVar116._16_4_ = (uint)!(bool)((byte)(uVar60 >> 4) & 1) * auVar92._16_4_;
            auVar116._20_4_ = (uint)!(bool)((byte)(uVar60 >> 5) & 1) * auVar92._20_4_;
            auVar116._24_4_ = (uint)!(bool)((byte)(uVar60 >> 6) & 1) * auVar92._24_4_;
            auVar116._28_4_ = (uint)!SUB81(uVar60 >> 7,0) * auVar92._28_4_;
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar60 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar60 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar60 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar92 = vsubps_avx512vl(auVar116,auVar83);
            auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar78._12_4_ |
                                                    (uint)!bVar16 * auVar19._12_4_,
                                                    CONCAT48((uint)bVar14 * (int)auVar78._8_4_ |
                                                             (uint)!bVar14 * auVar19._8_4_,
                                                             CONCAT44((uint)bVar12 *
                                                                      (int)auVar78._4_4_ |
                                                                      (uint)!bVar12 * auVar19._4_4_,
                                                                      (uint)(bVar59 & 1) *
                                                                      (int)auVar78._0_4_ |
                                                                      (uint)!(bool)(bVar59 & 1) *
                                                                      auVar19._0_4_)))),auVar86);
            auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar80._12_4_ |
                                                    (uint)!bVar17 * auVar20._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar80._8_4_ |
                                                             (uint)!bVar15 * auVar20._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar80._4_4_ |
                                                                      (uint)!bVar13 * auVar20._4_4_,
                                                                      (uint)(bVar59 & 1) *
                                                                      (int)auVar80._0_4_ |
                                                                      (uint)!(bool)(bVar59 & 1) *
                                                                      auVar20._0_4_)))),auVar112);
            auVar93 = vsubps_avx(auVar83,auVar113);
            auVar81 = vsubps_avx(auVar86,auVar114);
            auVar82 = vsubps_avx(auVar112,auVar115);
            auVar50._4_4_ = auVar94._4_4_ * fVar122;
            auVar50._0_4_ = auVar94._0_4_ * fVar120;
            auVar50._8_4_ = auVar94._8_4_ * fVar124;
            auVar50._12_4_ = auVar94._12_4_ * fVar126;
            auVar50._16_4_ = auVar94._16_4_ * 0.0;
            auVar50._20_4_ = auVar94._20_4_ * 0.0;
            auVar50._24_4_ = auVar94._24_4_ * 0.0;
            auVar50._28_4_ = 0;
            auVar76 = vfmsub231ps_fma(auVar50,auVar112,auVar92);
            auVar158._0_4_ = fVar121 * auVar92._0_4_;
            auVar158._4_4_ = fVar123 * auVar92._4_4_;
            auVar158._8_4_ = fVar125 * auVar92._8_4_;
            auVar158._12_4_ = fVar127 * auVar92._12_4_;
            auVar158._16_4_ = auVar92._16_4_ * 0.0;
            auVar158._20_4_ = auVar92._20_4_ * 0.0;
            auVar158._24_4_ = auVar92._24_4_ * 0.0;
            auVar158._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar158,auVar83,auVar98);
            auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar90,ZEXT1632(auVar76));
            auVar163._0_4_ = auVar98._0_4_ * auVar112._0_4_;
            auVar163._4_4_ = auVar98._4_4_ * auVar112._4_4_;
            auVar163._8_4_ = auVar98._8_4_ * auVar112._8_4_;
            auVar163._12_4_ = auVar98._12_4_ * auVar112._12_4_;
            auVar163._16_4_ = auVar98._16_4_ * fVar128;
            auVar163._20_4_ = auVar98._20_4_ * fVar152;
            auVar163._24_4_ = auVar98._24_4_ * fVar139;
            auVar163._28_4_ = 0;
            auVar76 = vfmsub231ps_fma(auVar163,auVar86,auVar94);
            auVar84 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar76));
            auVar96 = vmulps_avx512vl(auVar82,auVar113);
            auVar96 = vfmsub231ps_avx512vl(auVar96,auVar93,auVar115);
            auVar51._4_4_ = auVar81._4_4_ * auVar115._4_4_;
            auVar51._0_4_ = auVar81._0_4_ * auVar115._0_4_;
            auVar51._8_4_ = auVar81._8_4_ * auVar115._8_4_;
            auVar51._12_4_ = auVar81._12_4_ * auVar115._12_4_;
            auVar51._16_4_ = auVar81._16_4_ * fVar71;
            auVar51._20_4_ = auVar81._20_4_ * fVar70;
            auVar51._24_4_ = auVar81._24_4_ * fVar174;
            auVar51._28_4_ = iVar2;
            auVar76 = vfmsub231ps_fma(auVar51,auVar114,auVar82);
            auVar164._0_4_ = auVar114._0_4_ * auVar93._0_4_;
            auVar164._4_4_ = auVar114._4_4_ * auVar93._4_4_;
            auVar164._8_4_ = auVar114._8_4_ * auVar93._8_4_;
            auVar164._12_4_ = auVar114._12_4_ * auVar93._12_4_;
            auVar164._16_4_ = fVar170 * auVar93._16_4_;
            auVar164._20_4_ = fVar171 * auVar93._20_4_;
            auVar164._24_4_ = fVar140 * auVar93._24_4_;
            auVar164._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar164,auVar81,auVar113);
            auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar90,auVar96);
            auVar85 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar76));
            auVar96 = vmaxps_avx(auVar84,auVar85);
            uVar141 = vcmpps_avx512vl(auVar96,auVar90,2);
            bVar69 = bVar69 & (byte)uVar141;
            if (bVar69 != 0) {
              uVar129 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar187._4_4_ = uVar129;
              auVar187._0_4_ = uVar129;
              auVar187._8_4_ = uVar129;
              auVar187._12_4_ = uVar129;
              auVar187._16_4_ = uVar129;
              auVar187._20_4_ = uVar129;
              auVar187._24_4_ = uVar129;
              auVar187._28_4_ = uVar129;
              auVar191 = ZEXT3264(auVar187);
              auVar52._4_4_ = auVar82._4_4_ * auVar98._4_4_;
              auVar52._0_4_ = auVar82._0_4_ * auVar98._0_4_;
              auVar52._8_4_ = auVar82._8_4_ * auVar98._8_4_;
              auVar52._12_4_ = auVar82._12_4_ * auVar98._12_4_;
              auVar52._16_4_ = auVar82._16_4_ * auVar98._16_4_;
              auVar52._20_4_ = auVar82._20_4_ * auVar98._20_4_;
              auVar52._24_4_ = auVar82._24_4_ * auVar98._24_4_;
              auVar52._28_4_ = auVar96._28_4_;
              auVar18 = vfmsub231ps_fma(auVar52,auVar81,auVar94);
              auVar53._4_4_ = auVar94._4_4_ * auVar93._4_4_;
              auVar53._0_4_ = auVar94._0_4_ * auVar93._0_4_;
              auVar53._8_4_ = auVar94._8_4_ * auVar93._8_4_;
              auVar53._12_4_ = auVar94._12_4_ * auVar93._12_4_;
              auVar53._16_4_ = auVar94._16_4_ * auVar93._16_4_;
              auVar53._20_4_ = auVar94._20_4_ * auVar93._20_4_;
              auVar53._24_4_ = auVar94._24_4_ * auVar93._24_4_;
              auVar53._28_4_ = auVar94._28_4_;
              auVar77 = vfmsub231ps_fma(auVar53,auVar92,auVar82);
              auVar54._4_4_ = auVar81._4_4_ * auVar92._4_4_;
              auVar54._0_4_ = auVar81._0_4_ * auVar92._0_4_;
              auVar54._8_4_ = auVar81._8_4_ * auVar92._8_4_;
              auVar54._12_4_ = auVar81._12_4_ * auVar92._12_4_;
              auVar54._16_4_ = auVar81._16_4_ * auVar92._16_4_;
              auVar54._20_4_ = auVar81._20_4_ * auVar92._20_4_;
              auVar54._24_4_ = auVar81._24_4_ * auVar92._24_4_;
              auVar54._28_4_ = auVar81._28_4_;
              auVar19 = vfmsub231ps_fma(auVar54,auVar93,auVar98);
              auVar76 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar77),ZEXT1632(auVar19));
              auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar18),auVar90);
              auVar98 = vrcp14ps_avx512vl(auVar96);
              auVar93 = auVar195._0_32_;
              auVar94 = vfnmadd213ps_avx512vl(auVar98,auVar96,auVar93);
              auVar76 = vfmadd132ps_fma(auVar94,auVar98,auVar98);
              auVar55._4_4_ = auVar19._4_4_ * auVar112._4_4_;
              auVar55._0_4_ = auVar19._0_4_ * auVar112._0_4_;
              auVar55._8_4_ = auVar19._8_4_ * auVar112._8_4_;
              auVar55._12_4_ = auVar19._12_4_ * auVar112._12_4_;
              auVar55._16_4_ = fVar128 * 0.0;
              auVar55._20_4_ = fVar152 * 0.0;
              auVar55._24_4_ = fVar139 * 0.0;
              auVar55._28_4_ = iVar1;
              auVar77 = vfmadd231ps_fma(auVar55,auVar86,ZEXT1632(auVar77));
              auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar83,ZEXT1632(auVar18));
              fVar128 = auVar76._0_4_;
              fVar152 = auVar76._4_4_;
              fVar139 = auVar76._8_4_;
              fVar140 = auVar76._12_4_;
              local_600 = ZEXT1632(CONCAT412(auVar77._12_4_ * fVar140,
                                             CONCAT48(auVar77._8_4_ * fVar139,
                                                      CONCAT44(auVar77._4_4_ * fVar152,
                                                               auVar77._0_4_ * fVar128))));
              uVar141 = vcmpps_avx512vl(local_600,auVar187,2);
              auVar57._4_4_ = uStack_6fc;
              auVar57._0_4_ = local_700;
              auVar57._8_4_ = uStack_6f8;
              auVar57._12_4_ = uStack_6f4;
              auVar57._16_4_ = uStack_6f0;
              auVar57._20_4_ = uStack_6ec;
              auVar57._24_4_ = uStack_6e8;
              auVar57._28_4_ = uStack_6e4;
              uVar24 = vcmpps_avx512vl(local_600,auVar57,0xd);
              bVar69 = (byte)uVar141 & (byte)uVar24 & bVar69;
              if (bVar69 != 0) {
                uVar141 = vcmpps_avx512vl(auVar96,auVar90,4);
                bVar69 = bVar69 & (byte)uVar141;
                auVar194 = ZEXT3264(local_8c0);
                auVar193 = ZEXT3264(local_8e0);
                if (bVar69 != 0) {
                  fVar171 = auVar84._0_4_ * fVar128;
                  fVar170 = auVar84._4_4_ * fVar152;
                  auVar56._4_4_ = fVar170;
                  auVar56._0_4_ = fVar171;
                  fVar174 = auVar84._8_4_ * fVar139;
                  auVar56._8_4_ = fVar174;
                  fVar70 = auVar84._12_4_ * fVar140;
                  auVar56._12_4_ = fVar70;
                  fVar71 = auVar84._16_4_ * 0.0;
                  auVar56._16_4_ = fVar71;
                  fVar120 = auVar84._20_4_ * 0.0;
                  auVar56._20_4_ = fVar120;
                  fVar121 = auVar84._24_4_ * 0.0;
                  auVar56._24_4_ = fVar121;
                  auVar56._28_4_ = auVar96._28_4_;
                  auVar98 = vsubps_avx512vl(auVar93,auVar56);
                  local_640._0_4_ =
                       (float)((uint)(bVar59 & 1) * (int)fVar171 |
                              (uint)!(bool)(bVar59 & 1) * auVar98._0_4_);
                  bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
                  local_640._4_4_ =
                       (float)((uint)bVar12 * (int)fVar170 | (uint)!bVar12 * auVar98._4_4_);
                  bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
                  local_640._8_4_ =
                       (float)((uint)bVar12 * (int)fVar174 | (uint)!bVar12 * auVar98._8_4_);
                  bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
                  local_640._12_4_ =
                       (float)((uint)bVar12 * (int)fVar70 | (uint)!bVar12 * auVar98._12_4_);
                  bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
                  local_640._16_4_ =
                       (float)((uint)bVar12 * (int)fVar71 | (uint)!bVar12 * auVar98._16_4_);
                  bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
                  local_640._20_4_ =
                       (float)((uint)bVar12 * (int)fVar120 | (uint)!bVar12 * auVar98._20_4_);
                  bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
                  local_640._24_4_ =
                       (float)((uint)bVar12 * (int)fVar121 | (uint)!bVar12 * auVar98._24_4_);
                  bVar12 = SUB81(uVar60 >> 7,0);
                  local_640._28_4_ =
                       (float)((uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar98._28_4_);
                  auVar96 = vsubps_avx(ZEXT1632(auVar75),auVar87);
                  auVar76 = vfmadd213ps_fma(auVar96,local_640,auVar87);
                  uVar129 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                  auVar32._4_4_ = uVar129;
                  auVar32._0_4_ = uVar129;
                  auVar32._8_4_ = uVar129;
                  auVar32._12_4_ = uVar129;
                  auVar32._16_4_ = uVar129;
                  auVar32._20_4_ = uVar129;
                  auVar32._24_4_ = uVar129;
                  auVar32._28_4_ = uVar129;
                  auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                                               CONCAT48(auVar76._8_4_ +
                                                                        auVar76._8_4_,
                                                                        CONCAT44(auVar76._4_4_ +
                                                                                 auVar76._4_4_,
                                                                                 auVar76._0_4_ +
                                                                                 auVar76._0_4_)))),
                                            auVar32);
                  uVar141 = vcmpps_avx512vl(local_600,auVar96,6);
                  if (((byte)uVar141 & bVar69) != 0) {
                    auVar146._0_4_ = auVar85._0_4_ * fVar128;
                    auVar146._4_4_ = auVar85._4_4_ * fVar152;
                    auVar146._8_4_ = auVar85._8_4_ * fVar139;
                    auVar146._12_4_ = auVar85._12_4_ * fVar140;
                    auVar146._16_4_ = auVar85._16_4_ * 0.0;
                    auVar146._20_4_ = auVar85._20_4_ * 0.0;
                    auVar146._24_4_ = auVar85._24_4_ * 0.0;
                    auVar146._28_4_ = 0;
                    auVar96 = vsubps_avx512vl(auVar93,auVar146);
                    auVar117._0_4_ =
                         (uint)(bVar59 & 1) * (int)auVar146._0_4_ |
                         (uint)!(bool)(bVar59 & 1) * auVar96._0_4_;
                    bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
                    auVar117._4_4_ =
                         (uint)bVar12 * (int)auVar146._4_4_ | (uint)!bVar12 * auVar96._4_4_;
                    bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
                    auVar117._8_4_ =
                         (uint)bVar12 * (int)auVar146._8_4_ | (uint)!bVar12 * auVar96._8_4_;
                    bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
                    auVar117._12_4_ =
                         (uint)bVar12 * (int)auVar146._12_4_ | (uint)!bVar12 * auVar96._12_4_;
                    bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
                    auVar117._16_4_ =
                         (uint)bVar12 * (int)auVar146._16_4_ | (uint)!bVar12 * auVar96._16_4_;
                    bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
                    auVar117._20_4_ =
                         (uint)bVar12 * (int)auVar146._20_4_ | (uint)!bVar12 * auVar96._20_4_;
                    bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
                    auVar117._24_4_ =
                         (uint)bVar12 * (int)auVar146._24_4_ | (uint)!bVar12 * auVar96._24_4_;
                    auVar117._28_4_ = (uint)!SUB81(uVar60 >> 7,0) * auVar96._28_4_;
                    auVar33._8_4_ = 0x40000000;
                    auVar33._0_8_ = 0x4000000040000000;
                    auVar33._12_4_ = 0x40000000;
                    auVar33._16_4_ = 0x40000000;
                    auVar33._20_4_ = 0x40000000;
                    auVar33._24_4_ = 0x40000000;
                    auVar33._28_4_ = 0x40000000;
                    local_620 = vfmsub132ps_avx512vl(auVar117,auVar93,auVar33);
                    local_5e0 = (undefined4)lVar67;
                    local_5d0 = local_870._0_8_;
                    uStack_5c8 = local_870._8_8_;
                    local_5c0 = local_880._0_8_;
                    uStack_5b8 = local_880._8_8_;
                    local_5b0 = local_890._0_8_;
                    uStack_5a8 = local_890._8_8_;
                    pGVar9 = (context->scene->geometries).items[uVar7].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                      bVar59 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar59 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar76 = vcvtsi2ss_avx512f(auVar195._0_16_,local_5e0);
                      fVar128 = auVar76._0_4_;
                      local_580[0] = (fVar128 + local_640._0_4_ + 0.0) * (float)local_440._0_4_;
                      local_580[1] = (fVar128 + local_640._4_4_ + 1.0) * (float)local_440._4_4_;
                      local_580[2] = (fVar128 + local_640._8_4_ + 2.0) * fStack_438;
                      local_580[3] = (fVar128 + local_640._12_4_ + 3.0) * fStack_434;
                      fStack_570 = (fVar128 + local_640._16_4_ + 4.0) * fStack_430;
                      fStack_56c = (fVar128 + local_640._20_4_ + 5.0) * fStack_42c;
                      fStack_568 = (fVar128 + local_640._24_4_ + 6.0) * fStack_428;
                      fStack_564 = fVar128 + local_640._28_4_ + 7.0;
                      local_560 = local_620;
                      local_540 = local_600;
                      lVar61 = 0;
                      uVar65 = (ulong)((byte)uVar141 & bVar69);
                      for (uVar60 = uVar65; (uVar60 & 1) == 0;
                          uVar60 = uVar60 >> 1 | 0x8000000000000000) {
                        lVar61 = lVar61 + 1;
                      }
                      local_740._0_4_ = (int)uVar63;
                      local_520 = auVar187;
                      local_5dc = iVar8;
                      do {
                        auVar77 = auVar196._0_16_;
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[lVar61]));
                        local_480._0_8_ = lVar61;
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + lVar61 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_540 + lVar61 * 4);
                        local_910.context = context->user;
                        fVar140 = local_200._0_4_;
                        fVar152 = 1.0 - fVar140;
                        fVar128 = fVar152 * fVar152 * -3.0;
                        auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152)),
                                                  ZEXT416((uint)(fVar140 * fVar152)),
                                                  ZEXT416(0xc0000000));
                        auVar75 = vfmsub132ss_fma(ZEXT416((uint)(fVar140 * fVar152)),
                                                  ZEXT416((uint)(fVar140 * fVar140)),
                                                  ZEXT416(0x40000000));
                        fVar152 = auVar76._0_4_ * 3.0;
                        fVar139 = auVar75._0_4_ * 3.0;
                        fVar140 = fVar140 * fVar140 * 3.0;
                        auVar169._0_4_ = fVar140 * (float)local_710._0_4_;
                        auVar169._4_4_ = fVar140 * (float)local_710._4_4_;
                        auVar169._8_4_ = fVar140 * fStack_708;
                        auVar169._12_4_ = fVar140 * fStack_704;
                        auVar136._4_4_ = fVar139;
                        auVar136._0_4_ = fVar139;
                        auVar136._8_4_ = fVar139;
                        auVar136._12_4_ = fVar139;
                        auVar76 = vfmadd132ps_fma(auVar136,auVar169,local_890);
                        auVar156._4_4_ = fVar152;
                        auVar156._0_4_ = fVar152;
                        auVar156._8_4_ = fVar152;
                        auVar156._12_4_ = fVar152;
                        auVar76 = vfmadd132ps_fma(auVar156,auVar76,local_880);
                        auVar137._4_4_ = fVar128;
                        auVar137._0_4_ = fVar128;
                        auVar137._8_4_ = fVar128;
                        auVar137._12_4_ = fVar128;
                        auVar76 = vfmadd132ps_fma(auVar137,auVar76,local_870);
                        auVar138 = vbroadcastss_avx512f(auVar76);
                        auVar200 = vbroadcastss_avx512f(ZEXT416(1));
                        local_280 = vpermps_avx512f(auVar200,ZEXT1664(auVar76));
                        auVar200 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar200,ZEXT1664(auVar76));
                        local_2c0[0] = (RTCHitN)auVar138[0];
                        local_2c0[1] = (RTCHitN)auVar138[1];
                        local_2c0[2] = (RTCHitN)auVar138[2];
                        local_2c0[3] = (RTCHitN)auVar138[3];
                        local_2c0[4] = (RTCHitN)auVar138[4];
                        local_2c0[5] = (RTCHitN)auVar138[5];
                        local_2c0[6] = (RTCHitN)auVar138[6];
                        local_2c0[7] = (RTCHitN)auVar138[7];
                        local_2c0[8] = (RTCHitN)auVar138[8];
                        local_2c0[9] = (RTCHitN)auVar138[9];
                        local_2c0[10] = (RTCHitN)auVar138[10];
                        local_2c0[0xb] = (RTCHitN)auVar138[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar138[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar138[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar138[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar138[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar138[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar138[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar138[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar138[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar138[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar138[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar138[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar138[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar138[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar138[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar138[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar138[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar138[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar138[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar138[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar138[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar138[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar138[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar138[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar138[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar138[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar138[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar138[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar138[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar138[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar138[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar138[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar138[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar138[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar138[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar138[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar138[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar138[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar138[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar138[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar138[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar138[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar138[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar138[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar138[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar138[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar138[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar138[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar138[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar138[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar138[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar138[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar138[0x3f];
                        local_180 = local_4c0._0_8_;
                        uStack_178 = local_4c0._8_8_;
                        uStack_170 = local_4c0._16_8_;
                        uStack_168 = local_4c0._24_8_;
                        uStack_160 = local_4c0._32_8_;
                        uStack_158 = local_4c0._40_8_;
                        uStack_150 = local_4c0._48_8_;
                        uStack_148 = local_4c0._56_8_;
                        auVar138 = vmovdqa64_avx512f(local_500);
                        local_140 = vmovdqa64_avx512f(auVar138);
                        vpcmpeqd_avx2(auVar138._0_32_,auVar138._0_32_);
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]))
                        ;
                        auVar138 = vmovdqa64_avx512f(local_300);
                        local_6c0 = vmovdqa64_avx512f(auVar138);
                        local_910.valid = (int *)local_6c0;
                        local_910.geometryUserPtr = pGVar9->userPtr;
                        local_910.hit = local_2c0;
                        local_910.N = 0x10;
                        local_910.ray = (RTCRayN *)ray;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_910);
                          auVar191 = ZEXT3264(local_520);
                          uVar63 = (ulong)(uint)local_740._0_4_;
                          auVar193 = ZEXT3264(local_8e0);
                          auVar194 = ZEXT3264(local_8c0);
                          auVar198 = ZEXT3264(local_780);
                          auVar197 = ZEXT3264(local_760);
                          auVar76 = vxorps_avx512vl(auVar77,auVar77);
                          auVar196 = ZEXT1664(auVar76);
                          auVar138 = vmovdqa64_avx512f(local_6c0);
                        }
                        auVar76 = auVar196._0_16_;
                        uVar141 = vptestmd_avx512f(auVar138,auVar138);
                        if ((short)uVar141 == 0) {
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar195 = ZEXT3264(auVar96);
                          auVar201 = ZEXT3264(local_800);
                          auVar199 = ZEXT3264(local_820);
                          auVar138 = ZEXT3264(local_840);
                          auVar200 = ZEXT3264(local_860);
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var11)(&local_910);
                            auVar191 = ZEXT3264(local_520);
                            uVar63 = (ulong)(uint)local_740._0_4_;
                            auVar193 = ZEXT3264(local_8e0);
                            auVar194 = ZEXT3264(local_8c0);
                            auVar198 = ZEXT3264(local_780);
                            auVar197 = ZEXT3264(local_760);
                            auVar76 = vxorps_avx512vl(auVar76,auVar76);
                            auVar196 = ZEXT1664(auVar76);
                            auVar138 = vmovdqa64_avx512f(local_6c0);
                          }
                          uVar60 = vptestmd_avx512f(auVar138,auVar138);
                          auVar200 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar12 = (bool)((byte)uVar60 & 1);
                          auVar138._0_4_ =
                               (uint)bVar12 * auVar200._0_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x200);
                          bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
                          auVar138._4_4_ =
                               (uint)bVar12 * auVar200._4_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x204);
                          bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
                          auVar138._8_4_ =
                               (uint)bVar12 * auVar200._8_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x208);
                          bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
                          auVar138._12_4_ =
                               (uint)bVar12 * auVar200._12_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x20c);
                          bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
                          auVar138._16_4_ =
                               (uint)bVar12 * auVar200._16_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x210);
                          bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
                          auVar138._20_4_ =
                               (uint)bVar12 * auVar200._20_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x214);
                          bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
                          auVar138._24_4_ =
                               (uint)bVar12 * auVar200._24_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x218);
                          bVar12 = (bool)((byte)(uVar60 >> 7) & 1);
                          auVar138._28_4_ =
                               (uint)bVar12 * auVar200._28_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x21c);
                          bVar12 = (bool)((byte)(uVar60 >> 8) & 1);
                          auVar138._32_4_ =
                               (uint)bVar12 * auVar200._32_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x220);
                          bVar12 = (bool)((byte)(uVar60 >> 9) & 1);
                          auVar138._36_4_ =
                               (uint)bVar12 * auVar200._36_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x224);
                          bVar12 = (bool)((byte)(uVar60 >> 10) & 1);
                          auVar138._40_4_ =
                               (uint)bVar12 * auVar200._40_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x228);
                          bVar12 = (bool)((byte)(uVar60 >> 0xb) & 1);
                          auVar138._44_4_ =
                               (uint)bVar12 * auVar200._44_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x22c);
                          bVar12 = (bool)((byte)(uVar60 >> 0xc) & 1);
                          auVar138._48_4_ =
                               (uint)bVar12 * auVar200._48_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x230);
                          bVar12 = (bool)((byte)(uVar60 >> 0xd) & 1);
                          auVar138._52_4_ =
                               (uint)bVar12 * auVar200._52_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x234);
                          bVar12 = (bool)((byte)(uVar60 >> 0xe) & 1);
                          auVar138._56_4_ =
                               (uint)bVar12 * auVar200._56_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x238);
                          bVar12 = SUB81(uVar60 >> 0xf,0);
                          auVar138._60_4_ =
                               (uint)bVar12 * auVar200._60_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x23c);
                          *(undefined1 (*) [64])(local_910.ray + 0x200) = auVar138;
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar195 = ZEXT3264(auVar96);
                          auVar201 = ZEXT3264(local_800);
                          auVar199 = ZEXT3264(local_820);
                          auVar138 = ZEXT3264(local_840);
                          auVar200 = ZEXT3264(local_860);
                          if ((short)uVar60 != 0) {
                            bVar59 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x200) = auVar191._0_4_;
                        bVar59 = 0;
                        lVar61 = 0;
                        uVar65 = uVar65 ^ 1L << (local_480._0_8_ & 0x3f);
                        for (uVar60 = uVar65; (uVar60 & 1) == 0;
                            uVar60 = uVar60 >> 1 | 0x8000000000000000) {
                          lVar61 = lVar61 + 1;
                        }
                      } while (uVar65 != 0);
                    }
                    uVar63 = CONCAT71((int7)(uVar63 >> 8),(byte)uVar63 | bVar59);
                  }
                }
                goto LAB_01b86d01;
              }
            }
            auVar194 = ZEXT3264(local_8c0);
            auVar193 = ZEXT3264(local_8e0);
          }
LAB_01b86d01:
          lVar67 = lVar67 + 8;
        } while ((int)lVar67 < iVar8);
      }
      bVar69 = (byte)uVar63;
      if ((uVar63 & 1) != 0) break;
      uVar129 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar30._4_4_ = uVar129;
      auVar30._0_4_ = uVar129;
      auVar30._8_4_ = uVar129;
      auVar30._12_4_ = uVar129;
      uVar141 = vcmpps_avx512vl(local_650,auVar30,2);
      uVar66 = (uint)uVar68 & (uint)uVar68 + 0xf & (uint)uVar141;
      uVar68 = (ulong)uVar66;
    } while (uVar66 != 0);
  }
  return (bool)(bVar69 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }